

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

Value * __thiscall
anon_unknown.dwarf_18fa793::Target::Dump(Value *__return_storage_ptr__,Target *this)

{
  string *top;
  _Link_type __rhs;
  _Link_type __rhs_00;
  _Rb_tree_header *__key;
  _Base_ptr *pp_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
  *this_00;
  _Rb_tree_header *p_Var2;
  size_t *psVar3;
  unordered_map<(anonymous_namespace)::CompileData,_unsigned_int,_std::hash<(anonymous_namespace)::CompileData>,_std::equal_to<(anonymous_namespace)::CompileData>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>_>
  *this_01;
  __node_base_ptr *pp_Var4;
  __node_base *p_Var5;
  pointer *ppSVar6;
  size_type *psVar7;
  pointer *ppCVar8;
  _Base_ptr p_Var9;
  mapped_type_conflict3 mVar10;
  uint uVar11;
  UInt value;
  cmMakefile *pcVar12;
  cmInstallTargetGenerator *this_02;
  cmTarget *this_03;
  pointer pSVar13;
  pointer __first;
  pointer pBVar14;
  pointer pCVar15;
  pointer pCVar16;
  _Hash_node_base _Var17;
  pointer __first_00;
  pointer pSVar18;
  __normal_iterator<const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __last;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar19;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar20;
  undefined1 auVar21 [16];
  pointer ppcVar22;
  _Hash_node_base *p_Var23;
  pointer pJVar24;
  pointer pIVar25;
  pointer pIVar26;
  undefined8 uVar27;
  pointer ppcVar28;
  pointer pbVar29;
  size_type sVar30;
  bool bVar31;
  __type _Var32;
  TargetType targetType;
  JBTIndex *__cur;
  TargetType TVar33;
  string *psVar35;
  Value *pVVar36;
  cmLocalGenerator *pcVar37;
  string *psVar38;
  vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> *__x;
  OutputInfo *pOVar39;
  cmValue cVar40;
  cmGlobalGenerator *this_04;
  TargetDependSet *pTVar41;
  _Base_ptr p_Var42;
  iterator iVar43;
  _Rb_tree_node_base *p_Var44;
  _Rb_tree_node_base *p_Var45;
  JBTIndex JVar34;
  ArrayIndex value_00;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__n;
  pointer pJVar46;
  ValueHolder VVar47;
  undefined8 uVar48;
  cmFileSet *this_05;
  mapped_type_conflict3 *pmVar49;
  _Rb_tree_node_base *p_Var50;
  KindedSources *pKVar51;
  const_iterator cVar52;
  cmSourceGroup *pcVar53;
  _Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false> _Var54;
  pointer __result;
  pointer pSVar55;
  pointer pSVar56;
  CompileData *__k;
  Target *pTVar57;
  Target *pTVar58;
  iterator iVar59;
  _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var60;
  pointer pJVar61;
  pointer pJVar62;
  __hash_code _Var63;
  ValueHolder VVar64;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var65;
  ulong uVar66;
  pointer __result_00;
  pointer pCVar67;
  pointer pCVar68;
  pointer pJVar69;
  _Base_ptr p_Var70;
  long lVar71;
  __normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var72;
  __uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  this_06;
  ValueHolder VVar73;
  _Tp_alloc_type *__alloc;
  cmGeneratorTarget *pcVar74;
  _Hash_node_base _Var75;
  _Tp_alloc_type *__alloc_00;
  allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paVar76;
  JBTIndex bt;
  JBTIndex bt_00;
  string *path_00;
  string *path_01;
  _Base_ptr p_Var77;
  size_t __n_00;
  SourceGroup *__args;
  SourceGroup *__args_00;
  SourceGroup *extraout_RDX;
  ulong uVar78;
  CompileGroup *__args_01;
  CompileGroup *__args_02;
  CompileGroup *extraout_RDX_00;
  size_t __n_02;
  size_t __n_03;
  IncludeEntry *extraout_RDX_01;
  IncludeEntry *extraout_RDX_02;
  IncludeEntry *extraout_RDX_03;
  IncludeEntry *pIVar79;
  IncludeEntry *extraout_RDX_04;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar80;
  ValueHolder VVar81;
  pointer pSVar82;
  pointer pbVar83;
  _Alloc_hider dir;
  pointer pBVar84;
  pointer pSVar85;
  pointer pJVar86;
  _Base_ptr p_Var87;
  pointer ppcVar88;
  pointer __p;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar89;
  _Link_type __p_00;
  pointer bt_01;
  cmListFileBacktrace *__n_04;
  size_t sVar90;
  allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__n_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__n_06;
  __uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  _Var91;
  ulong uVar92;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  pointer ppcVar93;
  _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
  *p_Var94;
  long lVar95;
  iterator __pos;
  ValueHolder VVar96;
  __normal_iterator<const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __first_01;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar97;
  pair<std::__detail::_Node_iterator<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false,_false>,_bool>
  pVar98;
  undefined1 auVar99 [16];
  __uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  local_6d0;
  pointer local_6c0;
  string obj_dir;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_698 [2];
  vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> installGens;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_658;
  Value artifact;
  _Base_ptr p_Stack_620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_618;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  _Base_ptr local_5e8;
  _Base_ptr p_Stack_5e0;
  _Hash_node_base *local_5d8;
  vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5d0;
  vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5b8;
  __normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_5a0;
  pointer pJStack_598;
  pointer local_590;
  vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  local_588;
  vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  local_570;
  Value fsJson;
  _Alloc_hider _Stack_528;
  Value launchers;
  _Alloc_hider local_4f0;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  Value sourceGroups;
  string p;
  pointer local_3e0;
  _Rb_tree_node_base local_3d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  string COMPILE_DEFINITIONS;
  Value compileGroups;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  string tmp_1;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_2d8;
  bool isSystemInclude;
  Value local_2a8;
  Value dependencies;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string COMPILE_OPTIONS;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  string local_1d0;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_1b0;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_1a0;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_190;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_180;
  string COMPILE_FLAGS;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_type __n_01;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  targetType = cmGeneratorTarget::GetType(this->GT);
  psVar35 = cmGeneratorTarget::GetName_abi_cxx11_(this->GT);
  Json::Value::Value(&artifact,psVar35);
  pVVar36 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar36,&artifact);
  Json::Value::~Value(&artifact);
  psVar35 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  Json::Value::Value(&artifact,psVar35);
  pVVar36 = Json::Value::operator[](__return_storage_ptr__,"type");
  Json::Value::operator=(pVVar36,&artifact);
  Json::Value::~Value(&artifact);
  psVar35 = &this->TopBuild;
  TargetId((string *)&launchers,this->GT,psVar35);
  Json::Value::Value(&artifact,(String *)&launchers);
  pVVar36 = Json::Value::operator[](__return_storage_ptr__,"id");
  Json::Value::operator=(pVVar36,&artifact);
  Json::Value::~Value(&artifact);
  std::__cxx11::string::~string((string *)&launchers);
  Json::Value::Value(&launchers,objectValue);
  pcVar37 = cmGeneratorTarget::GetLocalGenerator(this->GT);
  psVar38 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(pcVar37);
  top = &this->TopSource;
  cmSystemTools::RelativeIfUnder(&p,top,psVar38);
  Json::Value::Value(&artifact,&p);
  pVVar36 = Json::Value::operator[](&launchers,"source");
  Json::Value::operator=(pVVar36,&artifact);
  Json::Value::~Value(&artifact);
  std::__cxx11::string::~string((string *)&p);
  psVar38 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar37);
  cmSystemTools::RelativeIfUnder(&p,psVar35,psVar38);
  Json::Value::Value(&artifact,&p);
  pVVar36 = Json::Value::operator[](&launchers,"build");
  Json::Value::operator=(pVVar36,&artifact);
  Json::Value::~Value(&artifact);
  std::__cxx11::string::~string((string *)&p);
  pVVar36 = Json::Value::operator[](__return_storage_ptr__,"paths");
  Json::Value::operator=(pVVar36,&launchers);
  Json::Value::~Value(&launchers);
  bVar31 = cmTarget::GetIsGeneratorProvided(this->GT->Target);
  if (bVar31) {
    Json::Value::Value(&artifact,true);
    pVVar36 = Json::Value::operator[](__return_storage_ptr__,"isGeneratorProvided");
    Json::Value::operator=(pVVar36,&artifact);
    Json::Value::~Value(&artifact);
  }
  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&artifact);
  AddBacktrace(this,__return_storage_ptr__,(cmListFileBacktrace *)&artifact);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&artifact.bits_);
  bVar31 = cmTarget::GetHaveInstallRule(this->GT->Target);
  if (bVar31) {
    Json::Value::Value((Value *)&obj_dir,objectValue);
    Json::Value::Value(&launchers,objectValue);
    pcVar12 = this->GT->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&artifact,"CMAKE_INSTALL_PREFIX",(allocator<char> *)&fsJson);
    psVar38 = cmMakefile::GetSafeDefinition(pcVar12,(string *)&artifact);
    std::__cxx11::string::string((string *)&p,(string *)psVar38);
    std::__cxx11::string::~string((string *)&artifact);
    cmsys::SystemTools::ConvertToUnixSlashes(&p);
    Json::Value::Value(&artifact,&p);
    pVVar36 = Json::Value::operator[](&launchers,"path");
    Json::Value::operator=(pVVar36,&artifact);
    Json::Value::~Value(&artifact);
    std::__cxx11::string::~string((string *)&p);
    pVVar36 = Json::Value::operator[]((Value *)&obj_dir,"prefix");
    Json::Value::operator=(pVVar36,&launchers);
    Json::Value::~Value(&launchers);
    Json::Value::Value((Value *)&p,arrayValue);
    __x = cmTarget::GetInstallGenerators(this->GT->Target);
    std::vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>::vector
              (&installGens,__x);
    ppcVar22 = installGens.
               super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar88 = installGens.
                    super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppcVar88 != ppcVar22;
        ppcVar88 = ppcVar88 + 1) {
      this_02 = *ppcVar88;
      Json::Value::Value(&launchers,objectValue);
      cmInstallTargetGenerator::GetDestination((string *)&fsJson,this_02,this->Config);
      Json::Value::Value(&artifact,(String *)&fsJson);
      pVVar36 = Json::Value::operator[](&launchers,"path");
      Json::Value::operator=(pVVar36,&artifact);
      Json::Value::~Value(&artifact);
      std::__cxx11::string::~string((string *)&fsJson);
      AddBacktrace(this,&launchers,&(this_02->super_cmInstallGenerator).Backtrace);
      Json::Value::append((Value *)&p,&launchers);
      Json::Value::~Value(&launchers);
    }
    std::_Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>::
    ~_Vector_base(&installGens.
                   super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                 );
    pVVar36 = Json::Value::operator[]((Value *)&obj_dir,"destinations");
    Json::Value::operator=(pVVar36,(Value *)&p);
    Json::Value::~Value((Value *)&p);
    pVVar36 = Json::Value::operator[](__return_storage_ptr__,"install");
    Json::Value::operator=(pVVar36,(Value *)&obj_dir);
    Json::Value::~Value((Value *)&obj_dir);
  }
  bVar31 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (bVar31) {
    Json::Value::Value((Value *)&p,arrayValue);
    TVar33 = cmGeneratorTarget::GetType(this->GT);
    if (TVar33 == OBJECT_LIBRARY) {
      bVar31 = cmTarget::HasKnownObjectFileLocation(this->GT->Target,(string *)0x0);
      if (bVar31) {
        objectSources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        objectSources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._0_16_ = ZEXT816(0);
        cmGeneratorTarget::GetObjectSources(this->GT,&objectSources,this->Config);
        cmGeneratorTarget::GetObjectDirectory(&obj_dir,this->GT,this->Config);
        ppcVar28 = objectSources.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        for (ppcVar93 = objectSources.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppcVar93 != ppcVar28;
            ppcVar93 = ppcVar93 + 1) {
          psVar38 = cmGeneratorTarget::GetObjectName_abi_cxx11_(this->GT,*ppcVar93);
          Json::Value::Value(&artifact,objectValue);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &installGens,&obj_dir,psVar38);
          cmSystemTools::RelativeIfUnder
                    ((string *)&fsJson,psVar35,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &installGens);
          Json::Value::Value(&launchers,(String *)&fsJson);
          pVVar36 = Json::Value::operator[](&artifact,"path");
          Json::Value::operator=(pVVar36,&launchers);
          Json::Value::~Value(&launchers);
          std::__cxx11::string::~string((string *)&fsJson);
          std::__cxx11::string::~string((string *)&installGens);
          Json::Value::append((Value *)&p,&artifact);
          Json::Value::~Value(&artifact);
        }
        std::__cxx11::string::~string((string *)&obj_dir);
        std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::
        ~_Vector_base(&objectSources.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     );
      }
    }
    else {
      Json::Value::Value(&artifact,objectValue);
      cmGeneratorTarget::GetFullPath
                ((string *)&fsJson,this->GT,this->Config,RuntimeBinaryArtifact,false);
      cmSystemTools::RelativeIfUnder(&obj_dir,psVar35,(string *)&fsJson);
      Json::Value::Value(&launchers,&obj_dir);
      pVVar36 = Json::Value::operator[](&artifact,"path");
      Json::Value::operator=(pVVar36,&launchers);
      Json::Value::~Value(&launchers);
      std::__cxx11::string::~string((string *)&obj_dir);
      std::__cxx11::string::~string((string *)&fsJson);
      Json::Value::append((Value *)&p,&artifact);
      Json::Value::~Value(&artifact);
      bVar31 = cmGeneratorTarget::HasImportLibrary(this->GT,this->Config);
      if (bVar31) {
        Json::Value::Value(&artifact,objectValue);
        cmGeneratorTarget::GetFullPath
                  ((string *)&fsJson,this->GT,this->Config,ImportLibraryArtifact,false);
        cmSystemTools::RelativeIfUnder(&obj_dir,psVar35,(string *)&fsJson);
        Json::Value::Value(&launchers,&obj_dir);
        pVVar36 = Json::Value::operator[](&artifact,"path");
        Json::Value::operator=(pVVar36,&launchers);
        Json::Value::~Value(&launchers);
        std::__cxx11::string::~string((string *)&obj_dir);
        std::__cxx11::string::~string((string *)&fsJson);
        Json::Value::append((Value *)&p,&artifact);
        Json::Value::~Value(&artifact);
      }
      bVar31 = cmGeneratorTarget::IsDLLPlatform(this->GT);
      if ((((bVar31) && (TVar33 = cmGeneratorTarget::GetType(this->GT), TVar33 != STATIC_LIBRARY))
          && (pOVar39 = cmGeneratorTarget::GetOutputInfo(this->GT,this->Config),
             pOVar39 != (OutputInfo *)0x0)) && ((pOVar39->PdbDir)._M_string_length != 0)) {
        Json::Value::Value(&artifact,objectValue);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &installGens,&pOVar39->PdbDir,'/');
        cmGeneratorTarget::GetPDBName((string *)&objectSources,this->GT,this->Config);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fsJson,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &installGens,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &objectSources);
        cmSystemTools::RelativeIfUnder(&obj_dir,psVar35,(string *)&fsJson);
        Json::Value::Value(&launchers,&obj_dir);
        pVVar36 = Json::Value::operator[](&artifact,"path");
        Json::Value::operator=(pVVar36,&launchers);
        Json::Value::~Value(&launchers);
        std::__cxx11::string::~string((string *)&obj_dir);
        std::__cxx11::string::~string((string *)&fsJson);
        std::__cxx11::string::~string((string *)&objectSources);
        std::__cxx11::string::~string((string *)&installGens);
        Json::Value::append((Value *)&p,&artifact);
        Json::Value::~Value(&artifact);
      }
    }
    bVar31 = Json::Value::empty((Value *)&p);
    if (!bVar31) {
      pVVar36 = Json::Value::operator[](__return_storage_ptr__,"artifacts");
      Json::Value::operator=(pVVar36,(Value *)&p);
    }
    Json::Value::~Value((Value *)&p);
  }
  if (targetType - SHARED_LIBRARY < 2) {
LAB_00450a52:
    cmGeneratorTarget::GetFullName((string *)&launchers,this->GT,this->Config,RuntimeBinaryArtifact)
    ;
    Json::Value::Value(&artifact,(String *)&launchers);
    pVVar36 = Json::Value::operator[](__return_storage_ptr__,"nameOnDisk");
    Json::Value::operator=(pVVar36,&artifact);
    Json::Value::~Value(&artifact);
    std::__cxx11::string::~string((string *)&launchers);
    Json::Value::Value(&launchers,objectValue);
    cmGeneratorTarget::GetLinkerLanguage(&p,this->GT,this->Config);
    Json::Value::Value(&artifact,&p);
    pVVar36 = Json::Value::operator[](&launchers,"language");
    Json::Value::operator=(pVVar36,&artifact);
    Json::Value::~Value(&artifact);
    DumpLinkCommandFragments(&artifact,this);
    bVar31 = Json::Value::empty(&artifact);
    if (!bVar31) {
      pVVar36 = Json::Value::operator[](&launchers,"commandFragments");
      Json::Value::operator=(pVVar36,&artifact);
    }
    Json::Value::~Value(&artifact);
    pcVar12 = this->GT->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&artifact,"CMAKE_SYSROOT_LINK",(allocator<char> *)&obj_dir);
    cVar40 = cmMakefile::GetDefinition(pcVar12,(string *)&artifact);
    std::__cxx11::string::~string((string *)&artifact);
    if (cVar40.Value == (string *)0x0) {
      pcVar12 = this->GT->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&artifact,"CMAKE_SYSROOT",(allocator<char> *)&obj_dir);
      cVar40 = cmMakefile::GetDefinition(pcVar12,(string *)&artifact);
      std::__cxx11::string::~string((string *)&artifact);
      if (cVar40.Value != (string *)0x0) {
        DumpSysroot(&artifact,(Target *)cVar40.Value,path_01);
        pVVar36 = Json::Value::operator[](&launchers,"sysroot");
        goto LAB_00450c5a;
      }
    }
    else {
      DumpSysroot(&artifact,(Target *)cVar40.Value,path_00);
      pVVar36 = Json::Value::operator[](&launchers,"sysroot");
LAB_00450c5a:
      Json::Value::operator=(pVVar36,&artifact);
      Json::Value::~Value(&artifact);
    }
    bVar31 = cmGeneratorTarget::IsIPOEnabled(this->GT,&p,this->Config);
    if (bVar31) {
      Json::Value::Value(&artifact,true);
      pVVar36 = Json::Value::operator[](&launchers,"lto");
      Json::Value::operator=(pVVar36,&artifact);
      Json::Value::~Value(&artifact);
    }
    std::__cxx11::string::~string((string *)&p);
    pVVar36 = Json::Value::operator[](__return_storage_ptr__,"link");
    Json::Value::operator=(pVVar36,&launchers);
    Json::Value::~Value(&launchers);
    if (targetType != EXECUTABLE) goto LAB_00450fc8;
    Json::Value::Value(&launchers,nullValue);
    DumpLauncher(&artifact,this,"TEST_LAUNCHER","test");
    bVar31 = Json::Value::empty(&artifact);
    if (!bVar31) {
      Json::Value::append(&launchers,&artifact);
    }
    Json::Value::~Value(&artifact);
    pcVar12 = this->GT->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&artifact,"CMAKE_CROSSCOMPILING",(allocator<char> *)&p);
    bVar31 = cmMakefile::IsOn(pcVar12,(string *)&artifact);
    std::__cxx11::string::~string((string *)&artifact);
    if (bVar31) {
      DumpLauncher(&artifact,this,"CROSSCOMPILING_EMULATOR","emulator");
      bVar31 = Json::Value::empty(&artifact);
      if (!bVar31) {
        Json::Value::append(&launchers,&artifact);
      }
      Json::Value::~Value(&artifact);
    }
    bVar31 = Json::Value::empty(&launchers);
    if (!bVar31) {
      pVVar36 = Json::Value::operator[](__return_storage_ptr__,"launchers");
      Json::Value::operator=(pVVar36,&launchers);
    }
  }
  else {
    if (targetType != STATIC_LIBRARY) {
      if (targetType != EXECUTABLE) goto LAB_00450fc8;
      goto LAB_00450a52;
    }
    cmGeneratorTarget::GetFullName((string *)&launchers,this->GT,this->Config,RuntimeBinaryArtifact)
    ;
    Json::Value::Value(&artifact,(String *)&launchers);
    pVVar36 = Json::Value::operator[](__return_storage_ptr__,"nameOnDisk");
    Json::Value::operator=(pVVar36,&artifact);
    Json::Value::~Value(&artifact);
    std::__cxx11::string::~string((string *)&launchers);
    Json::Value::Value(&launchers,objectValue);
    DumpLinkCommandFragments(&artifact,this);
    bVar31 = Json::Value::empty(&artifact);
    if (!bVar31) {
      pVVar36 = Json::Value::operator[](&launchers,"commandFragments");
      Json::Value::operator=(pVVar36,&artifact);
    }
    Json::Value::~Value(&artifact);
    cmGeneratorTarget::GetLinkerLanguage(&p,this->GT,this->Config);
    bVar31 = cmGeneratorTarget::IsIPOEnabled(this->GT,&p,this->Config);
    if (bVar31) {
      Json::Value::Value(&artifact,true);
      pVVar36 = Json::Value::operator[](&launchers,"lto");
      Json::Value::operator=(pVVar36,&artifact);
      Json::Value::~Value(&artifact);
    }
    std::__cxx11::string::~string((string *)&p);
    pVVar36 = Json::Value::operator[](__return_storage_ptr__,"archive");
    Json::Value::operator=(pVVar36,&launchers);
  }
  Json::Value::~Value(&launchers);
LAB_00450fc8:
  Json::Value::Value(&dependencies,arrayValue);
  this_04 = cmGeneratorTarget::GetGlobalGenerator(this->GT);
  pTVar41 = cmGlobalGenerator::GetTargetDirectDepends(this_04,this->GT);
  for (p_Var42 = (pTVar41->
                 super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                 )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var42 !=
      &(pTVar41->
       super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>)._M_t.
       _M_impl.super__Rb_tree_header; p_Var42 = (_Base_ptr)std::_Rb_tree_increment(p_Var42)) {
    Json::Value::Value(&launchers,objectValue);
    TargetId(&p,*(cmGeneratorTarget **)(p_Var42 + 1),psVar35);
    Json::Value::Value(&artifact,&p);
    pVVar36 = Json::Value::operator[](&launchers,"id");
    Json::Value::operator=(pVVar36,&artifact);
    Json::Value::~Value(&artifact);
    std::__cxx11::string::~string((string *)&p);
    AddBacktrace(this,&launchers,(cmListFileBacktrace *)&p_Var42[1]._M_left);
    Json::Value::append(&dependencies,&launchers);
    Json::Value::~Value(&launchers);
  }
  bVar31 = Json::Value::empty(&dependencies);
  if (!bVar31) {
    pVVar36 = Json::Value::operator[](__return_storage_ptr__,"dependencies");
    Json::Value::operator=(pVVar36,&dependencies);
  }
  p.field_2._8_8_ = &p._M_string_length;
  p._M_string_length._0_4_ = 0;
  p.field_2._M_allocated_capacity = 0;
  local_3e0 = (pointer)0x0;
  cmGeneratorTarget::GetLanguages
            (this->GT,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&p,this->Config);
  this_00 = &this->CompileDataMap;
  p_Var2 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header;
  uVar48 = p.field_2._8_8_;
  do {
    if ((size_type *)uVar48 == &p._M_string_length) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&p);
      Json::Value::Value(&fsJson,nullValue);
      artifact._8_8_ = artifact._8_8_ & 0xffffffff00000000;
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl =
           (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
              )0x0;
      artifact.start_ = (ptrdiff_t)&artifact.bits_;
      this_03 = this->GT->Target;
      artifact.limit_ = artifact.start_;
      cmTarget::GetAllFileSetNames_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&sourceGroups,this_03);
      if (sourceGroups.value_.int_ != sourceGroups._8_8_) {
        Json::Value::Value(&launchers,arrayValue);
        Json::Value::operator=(&fsJson,&launchers);
        Json::Value::~Value(&launchers);
        uVar48 = sourceGroups._8_8_;
        mVar10 = 0;
        for (VVar96 = sourceGroups.value_; VVar96.int_ != uVar48;
            VVar96.string_ =
                 (char *)&((VVar96.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right) {
          this_05 = cmTarget::GetFileSet(this_03,(string *)VVar96.map_);
          if (this_05 == (cmFileSet *)0x0) {
            pcVar12 = this->GT->Makefile;
            psVar35 = cmTarget::GetName_abi_cxx11_(this_03);
            cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[32],std::__cxx11::string_const&,char_const(&)[25]>
                      ((string *)&launchers,(char (*) [9])0x725759,psVar35,
                       (char (*) [32])"\" is tracked to have file set \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       VVar96.map_,(char (*) [25])"\", but it was not found.");
            cmMakefile::IssueMessage(pcVar12,INTERNAL_ERROR,(string *)&launchers);
            std::__cxx11::string::~string((string *)&launchers);
          }
          else {
            cmFileSet::CompileFileEntries
                      ((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                        *)&compileGroups,this_05);
            cmFileSet::CompileDirectoryEntries(&directoryEntries,this_05);
            cmFileSet::EvaluateDirectoryEntries
                      (&directories,this_05,&directoryEntries,this->GT->LocalGenerator,this->Config,
                       this->GT,(cmGeneratorExpressionDAGChecker *)0x0);
            Json::Value::Value((Value *)&installGens,objectValue);
            Json::Value::Value(&launchers,&this_05->Name);
            pVVar36 = Json::Value::operator[]((Value *)&installGens,"name");
            Json::Value::operator=(pVVar36,&launchers);
            Json::Value::~Value(&launchers);
            Json::Value::Value(&launchers,&this_05->Type);
            pVVar36 = Json::Value::operator[]((Value *)&installGens,"type");
            Json::Value::operator=(pVVar36,&launchers);
            Json::Value::~Value(&launchers);
            objectSources.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._0_16_ = cmFileSetVisibilityToName(this_05->Visibility);
            std::__cxx11::string::string<cm::static_string_view,void>
                      ((string *)&obj_dir,(static_string_view *)&objectSources,
                       (allocator<char> *)&local_2a8);
            Json::Value::Value(&launchers,(String *)&obj_dir);
            pVVar36 = Json::Value::operator[]((Value *)&installGens,"visibility");
            Json::Value::operator=(pVVar36,&launchers);
            Json::Value::~Value(&launchers);
            std::__cxx11::string::~string((string *)&obj_dir);
            Json::Value::Value(&launchers,arrayValue);
            pbVar29 = directories.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar83 = directories.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar83 != pbVar29;
                pbVar83 = pbVar83 + 1) {
              cmSystemTools::RelativeIfUnder((string *)&objectSources,top,pbVar83);
              Json::Value::Value((Value *)&obj_dir,(string *)&objectSources);
              Json::Value::append(&launchers,(Value *)&obj_dir);
              Json::Value::~Value((Value *)&obj_dir);
              std::__cxx11::string::~string((string *)&objectSources);
            }
            pVVar36 = Json::Value::operator[]((Value *)&installGens,"baseDirectories");
            Json::Value::operator=(pVVar36,&launchers);
            Json::Value::~Value(&launchers);
            Json::Value::append(&fsJson,(Value *)&installGens);
            Json::Value::~Value((Value *)&installGens);
            uVar27 = compileGroups._8_8_;
            launchers._8_8_ = launchers._8_8_ & 0xffffffff00000000;
            launchers.comments_.ptr_._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl =
                 (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                    )0x0;
            launchers.start_ = (ptrdiff_t)&launchers.bits_;
            launchers.limit_ = launchers.start_;
            for (VVar64 = compileGroups.value_; p_Var50 = (_Rb_tree_node_base *)launchers.start_,
                VVar64.int_ != uVar27;
                VVar64.string_ = (char *)&((VVar64.map_)->_M_t)._M_impl.super__Rb_tree_header) {
              cmFileSet::EvaluateFileEntry
                        (this_05,&directories,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          *)&launchers,
                         (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                          *)VVar64.map_,this->GT->LocalGenerator,this->Config,this->GT,
                         (cmGeneratorExpressionDAGChecker *)0x0);
            }
            for (; p_Var50 != (_Rb_tree_node_base *)&launchers.bits_;
                p_Var50 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var50)) {
              p_Var87 = p_Var50[2]._M_parent;
              for (p_Var42 = *(_Base_ptr *)(p_Var50 + 2); p_Var42 != p_Var87; p_Var42 = p_Var42 + 1)
              {
                obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
                obj_dir._M_string_length = 0;
                obj_dir.field_2._M_allocated_capacity =
                     obj_dir.field_2._M_allocated_capacity & 0xffffffffffffff00;
                if (p_Var50[1]._M_parent == (_Base_ptr)0x0) {
                  std::__cxx11::string::_M_assign((string *)&obj_dir);
                }
                else {
                  objectSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start._0_1_ = 0x2f;
                  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                            ((string *)&installGens,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var50 + 1),(char *)&objectSources,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var42);
                  std::__cxx11::string::operator=((string *)&obj_dir,(string *)&installGens);
                  std::__cxx11::string::~string((string *)&installGens);
                }
                pmVar49 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                        *)&artifact,(key_type *)&obj_dir);
                *pmVar49 = mVar10;
                std::__cxx11::string::~string((string *)&obj_dir);
              }
            }
            mVar10 = mVar10 + 1;
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *)&launchers);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&directories);
            std::
            vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
            ::~vector(&directoryEntries);
            std::
            vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
            ::~vector((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       *)&compileGroups);
          }
        }
      }
      std::
      pair<Json::Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
      ::
      pair<Json::Value_&,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_&,_true>
                ((pair<Json::Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                  *)&p,&fsJson,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  *)&artifact);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sourceGroups);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)&artifact);
      Json::Value::~Value(&fsJson);
      bVar31 = Json::Value::isNull((Value *)&p);
      if (!bVar31) {
        pVVar36 = Json::Value::operator[](__return_storage_ptr__,"fileSets");
        Json::Value::operator=(pVVar36,(Value *)&p);
      }
      Json::Value::Value(&local_2a8,arrayValue);
      pKVar51 = cmGeneratorTarget::GetKindedSources(this->GT,this->Config);
      pSVar13 = (pKVar51->Sources).
                super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      this_01 = &this->CompileGroupMap;
      pp_Var4 = &(this->CompileGroupMap)._M_h._M_single_bucket;
      p_Var5 = &(this->CompileGroupMap)._M_h._M_before_begin;
      for (pSVar82 = (pKVar51->Sources).
                     super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                     ._M_impl.super__Vector_impl_data._M_start; pSVar82 != pSVar13;
          pSVar82 = pSVar82 + 1) {
        value_00 = Json::Value::size(&local_2a8);
        Json::Value::Value((Value *)&directories,objectValue);
        psVar35 = cmSourceFile::ResolveFullPath((pSVar82->Source).Value,(string *)0x0,(string *)0x0)
        ;
        std::__cxx11::string::string((string *)&path,(string *)psVar35);
        cmSystemTools::RelativeIfUnder((string *)&launchers,top,&path);
        Json::Value::Value(&artifact,(String *)&launchers);
        pVVar36 = Json::Value::operator[]((Value *)&directories,"path");
        Json::Value::operator=(pVVar36,&artifact);
        Json::Value::~Value(&artifact);
        std::__cxx11::string::~string((string *)&launchers);
        bVar31 = cmSourceFile::GetIsGenerated((pSVar82->Source).Value,GlobalAndLocal);
        if (bVar31) {
          Json::Value::Value(&artifact,true);
          pVVar36 = Json::Value::operator[]((Value *)&directories,"isGenerated");
          Json::Value::operator=(pVVar36,&artifact);
          Json::Value::~Value(&artifact);
        }
        AddBacktrace(this,(Value *)&directories,&(pSVar82->Source).Backtrace);
        cVar52 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&local_3e0,&path);
        if (cVar52._M_node != &local_3d8) {
          Json::Value::Value(&artifact,cVar52._M_node[2]._M_color);
          pVVar36 = Json::Value::operator[]((Value *)&directories,"fileSetIndex");
          Json::Value::operator=(pVVar36,&artifact);
          Json::Value::~Value(&artifact);
        }
        pcVar53 = cmMakefile::FindSourceGroup(this->GT->Makefile,&path,&this->SourceGroupsLocal);
        if (pcVar53 != (cmSourceGroup *)0x0) {
          obj_dir._M_dataplus._M_p = (pointer)pcVar53;
          _Var54._M_cur =
               (__node_type *)
               std::
               _Hashtable<const_cmSourceGroup_*,_std::pair<const_cmSourceGroup_*const,_unsigned_int>,_std::allocator<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmSourceGroup_*>,_std::hash<const_cmSourceGroup_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->SourceGroupsMap)._M_h,(key_type *)&obj_dir);
          if (_Var54._M_cur == (__node_type *)0x0) {
            fsJson.value_.int_._0_4_ =
                 (int)(((long)(this->SourceGroups).
                              super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->SourceGroups).
                             super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x48);
            pVar98 = std::
                     _Hashtable<cmSourceGroup_const*,std::pair<cmSourceGroup_const*const,unsigned_int>,std::allocator<std::pair<cmSourceGroup_const*const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<cmSourceGroup_const*>,std::hash<cmSourceGroup_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                     ::_M_emplace<cmSourceGroup*&,unsigned_int&>
                               ((_Hashtable<cmSourceGroup_const*,std::pair<cmSourceGroup_const*const,unsigned_int>,std::allocator<std::pair<cmSourceGroup_const*const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<cmSourceGroup_const*>,std::hash<cmSourceGroup_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                 *)&this->SourceGroupsMap,&obj_dir,&fsJson);
            _Var54._M_cur =
                 (__node_type *)
                 pVar98.first.
                 super__Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
                 ._M_cur;
            artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
            artifact._12_4_ = 0;
            artifact.comments_.ptr_._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl =
                 (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  )((ulong)artifact.comments_.ptr_._M_t.
                           super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                           .
                           super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                           ._M_head_impl & 0xffffffffffffff00);
            artifact.value_ = (ValueHolder)&artifact.comments_;
            Json::Value::Value((Value *)&artifact.limit_,arrayValue);
            cmSourceGroup::GetFullName_abi_cxx11_((cmSourceGroup *)obj_dir._M_dataplus._M_p);
            std::__cxx11::string::_M_assign((string *)&artifact);
            pSVar56 = (this->SourceGroups).
                      super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (pSVar56 ==
                (this->SourceGroups).
                super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              __first = (this->SourceGroups).
                        super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar95 = (long)pSVar56 - (long)__first;
              if (lVar95 == 0x7ffffffffffffff8) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar66 = lVar95 / 0x48;
              __args_00 = (SourceGroup *)(lVar95 % 0x48);
              uVar78 = uVar66;
              if (pSVar56 == __first) {
                uVar78 = 1;
              }
              uVar92 = uVar78 + uVar66;
              __alloc = (_Tp_alloc_type *)0x1c71c71c71c71c7;
              if (0x1c71c71c71c71c6 < uVar92) {
                uVar92 = 0x1c71c71c71c71c7;
              }
              if (CARRY8(uVar78,uVar66)) {
                uVar92 = 0x1c71c71c71c71c7;
              }
              if (uVar92 == 0) {
                __result = (pointer)0x0;
              }
              else {
                __result = (pointer)operator_new(uVar92 * 0x48);
                __args_00 = extraout_RDX;
              }
              std::allocator_traits<std::allocator<(anonymous_namespace)::Target::SourceGroup>>::
              construct<(anonymous_namespace)::Target::SourceGroup,(anonymous_namespace)::Target::SourceGroup>
                        ((allocator_type *)(__result + uVar66),(SourceGroup *)&artifact,__args_00);
              pSVar55 = std::
                        vector<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                        ::_S_relocate(__first,pSVar56,__result,__alloc);
              pSVar56 = std::
                        vector<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                        ::_S_relocate(pSVar56,pSVar56,pSVar55 + 1,__alloc);
              lVar95 = (long)(this->SourceGroups).
                             super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
              std::
              _Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
              ::_M_deallocate((_Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                               *)__first,(pointer)(lVar95 / 0x48),lVar95 % 0x48);
              (this->SourceGroups).
              super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
              ._M_impl.super__Vector_impl_data._M_start = __result;
              (this->SourceGroups).
              super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
              ._M_impl.super__Vector_impl_data._M_finish = pSVar56;
              (this->SourceGroups).
              super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar92;
            }
            else {
              std::allocator_traits<std::allocator<(anonymous_namespace)::Target::SourceGroup>>::
              construct<(anonymous_namespace)::Target::SourceGroup,(anonymous_namespace)::Target::SourceGroup>
                        ((allocator_type *)pSVar56,(SourceGroup *)&artifact,__args);
              ppSVar6 = &(this->SourceGroups).
                         super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppSVar6 = *ppSVar6 + 1;
            }
            SourceGroup::~SourceGroup((SourceGroup *)&artifact);
          }
          uVar11 = *(uint *)((long)&((_Var54._M_cur)->
                                    super__Hash_node_value<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>
                                    ._M_storage._M_storage + 8);
          pSVar85 = (this->SourceGroups).
                    super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          Json::Value::Value(&artifact,value_00);
          Json::Value::append(&pSVar85[uVar11].SourceIndexes,&artifact);
          Json::Value::~Value(&artifact);
          Json::Value::Value(&launchers,
                             *(UInt *)((long)&((_Var54._M_cur)->
                                              super__Hash_node_value<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
                                              ).
                                              super__Hash_node_value_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>
                                              ._M_storage._M_storage + 8));
          pVVar36 = Json::Value::operator[]((Value *)&directories,"sourceGroupIndex");
          Json::Value::operator=(pVVar36,&launchers);
          Json::Value::~Value(&launchers);
        }
        if ((pSVar82->Kind == SourceKindObjectSource) ||
           (pSVar82->Kind == SourceKindCxxModuleSource)) {
          VVar96.map_ = (ObjectValues *)(pSVar82->Source).Value;
          CompileData::CompileData((CompileData *)&artifact);
          __k = (CompileData *)
                cmSourceFile::GetOrDetermineLanguage_abi_cxx11_((cmSourceFile *)VVar96.map_);
          std::__cxx11::string::_M_assign((string *)&artifact);
          if (artifact._8_8_ != 0) {
            pcVar37 = cmGeneratorTarget::GetLocalGenerator(this->GT);
            std::__cxx11::string::string((string *)&local_f0,(string *)this->Config);
            pcVar74 = this->GT;
            std::__cxx11::string::string((string *)&local_b0,(string *)&artifact);
            cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                      ((cmGeneratorExpressionInterpreter *)&launchers,pcVar37,&local_f0,pcVar74,
                       &local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&COMPILE_FLAGS,"COMPILE_FLAGS",(allocator<char> *)&obj_dir);
            cVar40 = cmSourceFile::GetProperty((cmSourceFile *)VVar96.map_,&COMPILE_FLAGS);
            if (cVar40.Value != (string *)0x0) {
              std::__cxx11::string::string((string *)&local_110,(string *)cVar40.Value);
              psVar35 = cmGeneratorExpressionInterpreter::Evaluate
                                  ((cmGeneratorExpressionInterpreter *)&launchers,&local_110,
                                   &COMPILE_FLAGS);
              std::__cxx11::string::string((string *)&obj_dir,(string *)psVar35);
              std::__cxx11::string::~string((string *)&local_110);
              pJVar69 = local_5d0.
                        super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              fsJson.value_.int_._0_4_ = 0xffffffff;
              if (local_5d0.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_5d0.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                sVar90 = 1;
                p_Var60 = (_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)std::
                             vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::_M_check_len(&local_5d0,1,"vector::_M_realloc_insert");
                pJVar24 = local_5d0.
                          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                pJVar86 = local_5d0.
                          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pTVar57 = (Target *)
                          std::
                          _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::_M_allocate(p_Var60,sVar90);
                std::
                allocator_traits<std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>::
                construct<(anonymous_namespace)::JBT<std::__cxx11::string>,std::__cxx11::string,(anonymous_namespace)::JBTIndex>
                          ((allocator_type *)(((long)pJVar69 - (long)pJVar86) + (long)pTVar57),
                           (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&obj_dir,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &fsJson,(JBTIndex *)pcVar74);
                pJVar62 = std::
                          vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::_S_relocate(pJVar86,pJVar69,(pointer)pTVar57,(_Tp_alloc_type *)pcVar74);
                pTVar58 = (Target *)
                          std::
                          vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::_S_relocate(pJVar69,pJVar24,pJVar62 + 1,(_Tp_alloc_type *)pcVar74);
                std::
                _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::_M_deallocate((_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)pJVar86,
                                (pointer)(((long)local_5d0.
                                                 super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          - (long)pJVar86) / 0x28),
                                ((long)local_5d0.
                                       super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pJVar86) % 0x28);
                local_5d0.
                super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)((long)&pTVar57->GT + (long)p_Var60 * 0x28);
                local_5d0.
                super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar57;
              }
              else {
                std::
                allocator_traits<std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>::
                construct<(anonymous_namespace)::JBT<std::__cxx11::string>,std::__cxx11::string,(anonymous_namespace)::JBTIndex>
                          ((allocator_type *)
                           local_5d0.
                           super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&obj_dir,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &fsJson,(JBTIndex *)pcVar74);
                pTVar58 = (Target *)
                          ((long)&((string *)
                                  ((long)local_5d0.
                                         super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + 0x10))->
                                  field_2 + 8);
              }
              local_5d0.
              super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)pTVar58;
              std::__cxx11::string::~string((string *)&obj_dir);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&COMPILE_OPTIONS,"COMPILE_OPTIONS",(allocator<char> *)&obj_dir);
            pBVar14 = *(pointer *)(VVar96.int_ + 0x130);
            for (pBVar84 = (((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)(VVar96.int_ + 0x128))->
                           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start; pBVar84 != pBVar14;
                pBVar84 = pBVar84 + 1) {
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&obj_dir,pBVar84);
              std::__cxx11::string::string((string *)&local_130,(string *)&obj_dir);
              cmGeneratorExpressionInterpreter::Evaluate
                        ((cmGeneratorExpressionInterpreter *)&launchers,&local_130,&COMPILE_OPTIONS)
              ;
              std::__cxx11::string::_M_assign((string *)&obj_dir);
              std::__cxx11::string::~string((string *)&local_130);
              objectSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              objectSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)&objectSources.
                             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              objectSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)objectSources.
                                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffffffffff00);
              cmLocalGenerator::AppendCompileOptions
                        (pcVar37,(string *)&objectSources,&obj_dir,(char *)0x0);
              std::__cxx11::string::string((string *)&local_50,(string *)&objectSources);
              std::
              __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ::__shared_ptr(&local_180,local_698);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&fsJson,&local_50,(cmListFileBacktrace *)&local_180);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_180._M_refcount);
              std::__cxx11::string::~string((string *)&local_50);
              (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                        ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&installGens,this,
                         (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&fsJson);
              std::
              vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
              ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                        ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                          *)&local_5d0,
                         (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&installGens);
              std::__cxx11::string::~string((string *)&installGens);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              ~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&fsJson);
              std::__cxx11::string::~string((string *)&objectSources);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              ~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&obj_dir);
            }
            pcVar74 = this->GT;
            psVar35 = this->Config;
            std::_Optional_payload_base<std::__cxx11::string>::
            _Optional_payload_base<std::__cxx11::string&>
                      ((_Optional_payload_base<std::__cxx11::string> *)&compileGroups,&artifact);
            cmGeneratorTarget::GetAppleArchs
                      (&architectures,pcVar74,psVar35,
                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&compileGroups);
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&compileGroups);
            if (architectures.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                architectures.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::emplace_back<>(&architectures);
            }
            pbVar29 = architectures.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            VVar64.string_ = (char *)&_Stack_528;
            fsJson.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x1;
            fsJson._12_4_ = 0;
            fsJson.comments_.ptr_._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl =
                 (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                    )0x0;
            fsJson.start_ = 0;
            fsJson.limit_._0_4_ = 0x3f800000;
            _Stack_528._M_p = (pointer)0x0;
            fsJson.value_.string_ = VVar64.string_;
            for (pbVar83 = architectures.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar83 != pbVar29;
                pbVar83 = pbVar83 + 1) {
              VVar64.string_ = (char *)&artifact;
              cmGeneratorTarget::GetPchSource
                        ((string *)&installGens,this->GT,this->Config,(string *)VVar64.map_,pbVar83)
              ;
              if (installGens.
                  super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&obj_dir,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &installGens,pbVar83);
                std::
                _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::_M_emplace<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)&fsJson,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&obj_dir);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&obj_dir);
              }
              std::__cxx11::string::~string((string *)&installGens);
            }
            if (fsJson.start_ != 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&obj_dir,"SKIP_PRECOMPILE_HEADERS",
                         (allocator<char> *)&installGens);
              cVar40 = cmSourceFile::GetProperty((cmSourceFile *)VVar96.map_,&obj_dir);
              std::__cxx11::string::~string((string *)&obj_dir);
              if (cVar40.Value == (string *)0x0) {
                sourceGroups.value_.string_ = (char *)&sourceGroups.comments_;
                sourceGroups.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
                sourceGroups._12_4_ = 0;
                sourceGroups.comments_.ptr_._M_t.
                super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                .
                super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                ._M_head_impl._0_1_ = 0;
                psVar35 = cmSourceFile::ResolveFullPath
                                    ((cmSourceFile *)VVar96.map_,(string *)0x0,(string *)0x0);
                iVar59 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)&fsJson,psVar35);
                if (iVar59.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  installGens.
                  super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)&installGens.
                                 super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  installGens.
                  super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  installGens.
                  super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)((ulong)installGens.
                                        super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage &
                                0xffffffffffffff00);
                  pBVar80 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&installGens;
                  cmGeneratorTarget::GetPchUseCompileOptions
                            (&obj_dir,this->GT,this->Config,(string *)&artifact,(string *)pBVar80);
                  std::__cxx11::string::operator=((string *)&sourceGroups,(string *)&obj_dir);
                  std::__cxx11::string::~string((string *)&obj_dir);
                }
                else {
                  cmGeneratorTarget::GetPchCreateCompileOptions
                            (&obj_dir,this->GT,this->Config,(string *)&artifact,
                             (string *)
                             ((long)iVar59.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                    ._M_cur + 0x28));
                  std::__cxx11::string::operator=((string *)&sourceGroups,(string *)&obj_dir);
                  pBVar80 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&obj_dir;
                }
                std::__cxx11::string::~string((string *)pBVar80);
                std::__cxx11::string::string((string *)&local_150,(string *)&sourceGroups);
                local_2d8.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)0x0;
                local_2d8.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_2d8);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&obj_dir,&local_150,(cmListFileBacktrace *)&local_2d8);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_2d8.TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                std::__cxx11::string::~string((string *)&local_150);
                std::__cxx11::string::string((string *)&local_d0,(string *)&obj_dir);
                cmGeneratorExpressionInterpreter::Evaluate
                          ((cmGeneratorExpressionInterpreter *)&launchers,&local_d0,&COMPILE_OPTIONS
                          );
                std::__cxx11::string::_M_assign((string *)&obj_dir);
                std::__cxx11::string::~string((string *)&local_d0);
                tmp_1._M_dataplus._M_p = (pointer)&tmp_1.field_2;
                tmp_1._M_string_length = 0;
                tmp_1.field_2._M_local_buf[0] = '\0';
                VVar64.int_ = 0;
                cmLocalGenerator::AppendCompileOptions(pcVar37,&tmp_1,&obj_dir,(char *)0x0);
                std::__cxx11::string::string((string *)&local_70,(string *)&tmp_1);
                std::
                __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ::__shared_ptr(&local_190,local_698);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&installGens,&local_70,(cmListFileBacktrace *)&local_190);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_190._M_refcount);
                std::__cxx11::string::~string((string *)&local_70);
                (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                          ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&objectSources,this,
                           (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&installGens);
                std::
                vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                          ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                            *)&local_5d0,
                           (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&objectSources);
                std::__cxx11::string::~string((string *)&objectSources);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&installGens);
                std::__cxx11::string::~string((string *)&tmp_1);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&obj_dir);
                std::__cxx11::string::~string((string *)&sourceGroups);
              }
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&sourceGroups,"INCLUDE_DIRECTORIES",(allocator<char> *)&obj_dir);
            pBVar14 = *(pointer *)(VVar96.int_ + 0x160);
            for (pBVar84 = (((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)(VVar96.int_ + 0x158))->
                           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start; pBVar84 != pBVar14;
                pBVar84 = pBVar84 + 1) {
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&obj_dir,pBVar84);
              std::__cxx11::string::string((string *)&tmp_1,(string *)&obj_dir);
              cmGeneratorExpressionInterpreter::Evaluate
                        ((cmGeneratorExpressionInterpreter *)&launchers,&tmp_1,
                         (string *)&sourceGroups);
              std::__cxx11::string::_M_assign((string *)&obj_dir);
              std::__cxx11::string::~string((string *)&tmp_1);
              COMPILE_DEFINITIONS._M_dataplus._M_p = (pointer)0x0;
              COMPILE_DEFINITIONS._M_string_length = 0;
              COMPILE_DEFINITIONS.field_2._M_allocated_capacity = 0;
              VVar64.map_ = VVar96.map_;
              cmLocalGenerator::AppendIncludeDirectories
                        (pcVar37,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&COMPILE_DEFINITIONS,&obj_dir,(cmSourceFile *)VVar96.map_);
              sVar30 = COMPILE_DEFINITIONS._M_string_length;
              for (dir = COMPILE_DEFINITIONS._M_dataplus; dir._M_p != (pointer)sVar30;
                  dir._M_p = dir._M_p + 0x20) {
                VVar64.string_ = (char *)&artifact;
                isSystemInclude =
                     cmGeneratorTarget::IsSystemIncludeDirectory
                               (this->GT,(string *)dir._M_p,this->Config,(string *)VVar64.map_);
                std::__cxx11::string::string((string *)&local_238,(string *)dir._M_p);
                std::
                __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ::__shared_ptr(&local_1a0,local_698);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&installGens,&local_238,(cmListFileBacktrace *)&local_1a0);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_1a0._M_refcount);
                std::__cxx11::string::~string((string *)&local_238);
                bVar31 = cmGeneratorTarget::IsApple(this->GT);
                if ((bVar31) &&
                   (bVar31 = cmSystemTools::IsPathToFramework((string *)dir._M_p), bVar31)) {
                  (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                            ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&objectSources,this,
                             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&installGens);
                  std::
                  vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                  ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>,bool_const&>
                            ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                              *)&local_570,
                             (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&objectSources,&isSystemInclude);
                }
                else {
                  (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                            ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&objectSources,this,
                             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&installGens);
                  std::
                  vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                  ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>,bool_const&>
                            ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                              *)&local_588,
                             (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&objectSources,&isSystemInclude);
                }
                std::__cxx11::string::~string((string *)&objectSources);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&installGens);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&COMPILE_DEFINITIONS);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              ~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&obj_dir);
            }
            std::__cxx11::string::~string((string *)&sourceGroups);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&COMPILE_DEFINITIONS,"COMPILE_DEFINITIONS",
                       (allocator<char> *)&obj_dir);
            obj_dir._M_string_length = obj_dir._M_string_length & 0xffffffff00000000;
            obj_dir.field_2._M_allocated_capacity = 0;
            obj_dir.field_2._8_8_ = &obj_dir._M_string_length;
            local_698[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pBVar14 = *(pointer *)(VVar96.int_ + 0x148);
            local_698[0]._M_ptr = (element_type *)obj_dir.field_2._8_8_;
            for (pBVar84 = (((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)(VVar96.int_ + 0x140))->
                           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start; pBVar84 != pBVar14;
                pBVar84 = pBVar84 + 1) {
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&installGens,pBVar84);
              std::__cxx11::string::string((string *)&isSystemInclude,(string *)&installGens);
              cmGeneratorExpressionInterpreter::Evaluate
                        ((cmGeneratorExpressionInterpreter *)&launchers,(string *)&isSystemInclude,
                         &COMPILE_DEFINITIONS);
              std::__cxx11::string::_M_assign((string *)&installGens);
              std::__cxx11::string::~string((string *)&isSystemInclude);
              objectSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
              objectSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              cmLocalGenerator::AppendDefines
                        (pcVar37,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&objectSources,(string *)&installGens);
              for (p_Var50 = (_Rb_tree_node_base *)
                             &objectSources.
                              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  p_Var50 !=
                  (_Rb_tree_node_base *)
                  &objectSources.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
                  p_Var50 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var50)) {
                std::__cxx11::string::string((string *)&local_90,(string *)(p_Var50 + 1));
                std::
                __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ::__shared_ptr(&local_1b0,&local_658);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&sourceGroups,&local_90,(cmListFileBacktrace *)&local_1b0);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_1b0._M_refcount);
                std::__cxx11::string::~string((string *)&local_90);
                std::
                _Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
                ::_M_insert_unique<BT<std::__cxx11::string>const&>
                          ((_Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
                            *)&obj_dir,
                           (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&sourceGroups);
                BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&sourceGroups);
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&objectSources);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              ~BT((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&installGens);
            }
            installGens.
            super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((ulong)installGens.
                                  super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
            installGens.
            super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            p_Var50 = (_Rb_tree_node_base *)
                      &installGens.
                       super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            local_658._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_658._M_ptr = (element_type *)p_Var50;
            cmsys::SystemTools::UpperCase((string *)&objectSources,this->Config);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &sourceGroups,"COMPILE_DEFINITIONS_",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &objectSources);
            std::__cxx11::string::~string((string *)&objectSources);
            cVar40 = cmSourceFile::GetProperty((cmSourceFile *)VVar96.map_,(string *)&sourceGroups);
            if (cVar40.Value != (string *)0x0) {
              std::__cxx11::string::string((string *)&local_1d0,(string *)cVar40.Value);
              psVar35 = cmGeneratorExpressionInterpreter::Evaluate
                                  ((cmGeneratorExpressionInterpreter *)&launchers,&local_1d0,
                                   &COMPILE_DEFINITIONS);
              cmLocalGenerator::AppendDefines
                        (pcVar37,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&installGens,psVar35);
              std::__cxx11::string::~string((string *)&local_1d0);
            }
            __k = (CompileData *)
                  ((long)&(local_658._M_refcount._M_pi)->_vptr__Sp_counted_base +
                  (long)&(local_698[0]._M_refcount._M_pi)->_vptr__Sp_counted_base);
            std::
            vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::reserve(&local_5b8,(size_type)__k);
            for (uVar48 = obj_dir.field_2._8_8_; (size_type *)uVar48 != &obj_dir._M_string_length;
                uVar48 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar48)) {
              (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                        ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&objectSources,this,
                         (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(uVar48 + 0x20));
              __k = (CompileData *)&objectSources;
              std::
              vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
              ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                        ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                          *)&local_5b8,
                         (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&objectSources);
              std::__cxx11::string::~string((string *)&objectSources);
            }
            for (; pJVar69 = local_5b8.
                             super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                p_Var50 !=
                (_Rb_tree_node_base *)
                &installGens.
                 super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
                p_Var50 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var50)) {
              objectSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
              __k = (CompileData *)(p_Var50 + 1);
              if (local_5b8.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_5b8.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                sVar90 = 1;
                p_Var60 = (_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)std::
                             vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::_M_check_len(&local_5b8,1,"vector::_M_realloc_insert");
                pJVar24 = local_5b8.
                          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                pJVar86 = local_5b8.
                          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pJVar61 = std::
                          _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::_M_allocate(p_Var60,sVar90);
                std::
                allocator_traits<std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>::
                construct<(anonymous_namespace)::JBT<std::__cxx11::string>,std::__cxx11::string_const&,(anonymous_namespace)::JBTIndex>
                          ((allocator_type *)(((long)pJVar69 - (long)pJVar86) + (long)pJVar61),
                           (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)__k,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&objectSources,(JBTIndex *)VVar64.map_);
                pJVar62 = std::
                          vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::_S_relocate(pJVar86,pJVar69,pJVar61,(_Tp_alloc_type *)VVar64.map_);
                pJVar62 = std::
                          vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::_S_relocate(pJVar69,pJVar24,pJVar62 + 1,(_Tp_alloc_type *)VVar64.map_);
                VVar64.int_ = (LargestInt)&DAT_00000028;
                __k = (CompileData *)
                      (((long)local_5b8.
                              super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pJVar86) /
                      0x28);
                std::
                _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::_M_deallocate((_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)pJVar86,(pointer)__k,
                                ((long)local_5b8.
                                       super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pJVar86) % 0x28);
                local_5b8.
                super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = pJVar61 + (long)p_Var60;
                local_5b8.
                super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = pJVar61;
                local_5b8.
                super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = pJVar62;
              }
              else {
                std::
                allocator_traits<std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>::
                construct<(anonymous_namespace)::JBT<std::__cxx11::string>,std::__cxx11::string_const&,(anonymous_namespace)::JBTIndex>
                          ((allocator_type *)
                           local_5b8.
                           super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)__k,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&objectSources,(JBTIndex *)VVar64.map_);
                local_5b8.
                super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_5b8.
                     super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            std::__cxx11::string::~string((string *)&sourceGroups);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&installGens);
            std::
            _Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&obj_dir);
            std::__cxx11::string::~string((string *)&COMPILE_DEFINITIONS);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)&fsJson);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&architectures);
            std::__cxx11::string::~string((string *)&COMPILE_OPTIONS);
            std::__cxx11::string::~string((string *)&COMPILE_FLAGS);
            cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
                      ((cmGeneratorExpressionInterpreter *)&launchers);
          }
          _Var63 = std::__detail::
                   _Hash_code_base<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::__detail::_Select1st,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                   ::_M_hash_code((_Hash_code_base<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::__detail::_Select1st,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                                   *)&artifact,__k);
          VVar96.map_ = (ObjectValues *)
                        std::
                        _Hashtable<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<(anonymous_namespace)::CompileData>,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::_M_find_node(&this_01->_M_h,
                                       _Var63 % (this->CompileGroupMap)._M_h._M_bucket_count,
                                       (key_type *)&artifact,_Var63);
          if ((__node_ptr)VVar96.int_ == (__node_ptr)0x0) {
            pCVar15 = (this->CompileGroups).
                      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pCVar16 = (this->CompileGroups).
                      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            launchers.value_ = (ValueHolder)this_01;
            VVar64.string_ = (char *)operator_new(0x108);
            pIVar26 = local_570.
                      super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pIVar25 = local_588.
                      super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pJVar24 = local_590;
            pJVar86 = local_5b8.
                      super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pJVar69 = local_5d0.
                      super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            p_Var23 = local_5d8;
            uVar48 = local_608._8_8_;
            *(_Hash_node_base **)VVar64.string_ = (_Hash_node_base *)0x0;
            __key = &((VVar64.map_)->_M_t)._M_impl.super__Rb_tree_header;
            pp_Var1 = &((VVar64.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            *(_Base_ptr **)&((VVar64.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color =
                 pp_Var1;
            if (artifact.value_ == &artifact.comments_) {
              *pp_Var1 = (_Base_ptr)
                         artifact.comments_.ptr_._M_t.
                         super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                         .
                         super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                         ._M_head_impl;
              ((VVar64.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)artifact.start_;
            }
            else {
              *(ValueHolder *)&__key->_M_header = artifact.value_;
              *pp_Var1 = (_Base_ptr)
                         artifact.comments_.ptr_._M_t.
                         super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                         .
                         super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                         ._M_head_impl;
            }
            ((VVar64.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)artifact._8_8_;
            artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
            artifact._12_4_ = 0;
            artifact.comments_.ptr_._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl =
                 (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  )((ulong)artifact.comments_.ptr_._M_t.
                           super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                           .
                           super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                           ._M_head_impl & 0xffffffffffffff00);
            ((VVar64.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
                 (size_t)(VVar64.int_ + 0x38);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)artifact.limit_ == &local_618) {
              ((_Hash_node_base *)(VVar64.int_ + 0x38))->_M_nxt =
                   (_Hash_node_base *)local_618._M_allocated_capacity;
              ((_Hash_node_base *)(VVar64.int_ + 0x40))->_M_nxt = (_Hash_node_base *)local_618._8_8_
              ;
            }
            else {
              ((VVar64.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = artifact.limit_;
              ((_Hash_node_base *)(VVar64.int_ + 0x38))->_M_nxt =
                   (_Hash_node_base *)local_618._M_allocated_capacity;
            }
            ((_Hash_node_base *)(VVar64.int_ + 0x30))->_M_nxt = (_Hash_node_base *)0x0;
            local_618._M_allocated_capacity = local_618._M_allocated_capacity & 0xffffffffffffff00;
            ((_Hash_node_base *)(VVar64.int_ + 0x48))->_M_nxt =
                 (_Hash_node_base *)(VVar64.int_ + 0x58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_608._M_allocated_capacity == &local_5f8) {
              ((_Hash_node_base *)(VVar64.int_ + 0x58))->_M_nxt =
                   (_Hash_node_base *)
                   CONCAT71(local_5f8._M_allocated_capacity._1_7_,local_5f8._M_local_buf[0]);
              ((_Hash_node_base *)(VVar64.int_ + 0x60))->_M_nxt = (_Hash_node_base *)local_5f8._8_8_
              ;
            }
            else {
              ((_Hash_node_base *)(VVar64.int_ + 0x48))->_M_nxt =
                   (_Hash_node_base *)local_608._M_allocated_capacity;
              ((_Hash_node_base *)(VVar64.int_ + 0x58))->_M_nxt =
                   (_Hash_node_base *)
                   CONCAT71(local_5f8._M_allocated_capacity._1_7_,local_5f8._M_local_buf[0]);
            }
            local_608._8_8_ = (_Hash_node_base *)0x0;
            ((_Hash_node_base *)(VVar64.int_ + 0x50))->_M_nxt = (_Hash_node_base *)uVar48;
            local_5f8._M_local_buf[0] = '\0';
            ((_Hash_node_base *)(VVar64.int_ + 0x68))->_M_nxt = (_Hash_node_base *)local_5e8;
            ((_Hash_node_base *)(VVar64.int_ + 0x70))->_M_nxt = (_Hash_node_base *)p_Stack_5e0;
            local_5d8 = (_Hash_node_base *)0x0;
            ((_Hash_node_base *)(VVar64.int_ + 0x78))->_M_nxt = p_Var23;
            local_5e8 = (_Base_ptr)0x0;
            p_Stack_5e0 = (_Base_ptr)0x0;
            ((_Hash_node_base *)(VVar64.int_ + 0x80))->_M_nxt =
                 (_Hash_node_base *)
                 local_5d0.
                 super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            ((_Hash_node_base *)(VVar64.int_ + 0x88))->_M_nxt =
                 (_Hash_node_base *)
                 local_5d0.
                 super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_5d0.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ((_Hash_node_base *)(VVar64.int_ + 0x90))->_M_nxt = (_Hash_node_base *)pJVar69;
            local_5d0.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_5d0.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ((_Hash_node_base *)(VVar64.int_ + 0x98))->_M_nxt =
                 (_Hash_node_base *)
                 local_5b8.
                 super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            ((_Hash_node_base *)(VVar64.int_ + 0xa0))->_M_nxt =
                 (_Hash_node_base *)
                 local_5b8.
                 super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_5b8.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ((_Hash_node_base *)(VVar64.int_ + 0xa8))->_M_nxt = (_Hash_node_base *)pJVar86;
            local_5b8.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_5b8.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ((_Hash_node_base *)(VVar64.int_ + 0xb0))->_M_nxt =
                 (_Hash_node_base *)local_5a0._M_current;
            ((_Hash_node_base *)(VVar64.int_ + 0xb8))->_M_nxt = (_Hash_node_base *)pJStack_598;
            local_590 = (pointer)0x0;
            ((_Hash_node_base *)(VVar64.int_ + 0xc0))->_M_nxt = (_Hash_node_base *)pJVar24;
            local_5a0._M_current = (pointer)0x0;
            pJStack_598 = (pointer)0x0;
            ((_Hash_node_base *)(VVar64.int_ + 200))->_M_nxt =
                 (_Hash_node_base *)
                 local_588.
                 super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            ((_Hash_node_base *)(VVar64.int_ + 0xd0))->_M_nxt =
                 (_Hash_node_base *)
                 local_588.
                 super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_588.
            super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ((_Hash_node_base *)(VVar64.int_ + 0xd8))->_M_nxt = (_Hash_node_base *)pIVar25;
            local_588.
            super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_588.
            super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ((_Hash_node_base *)(VVar64.int_ + 0xe0))->_M_nxt =
                 (_Hash_node_base *)
                 local_570.
                 super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            ((_Hash_node_base *)(VVar64.int_ + 0xe8))->_M_nxt =
                 (_Hash_node_base *)
                 local_570.
                 super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_570.
            super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ((_Hash_node_base *)(VVar64.int_ + 0xf0))->_M_nxt = (_Hash_node_base *)pIVar26;
            local_570.
            super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_570.
            super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            *(int *)&((_Hash_node_base *)(VVar64.int_ + 0xf8))->_M_nxt =
                 (int)(((long)pCVar15 - (long)pCVar16) / 0x30);
            artifact.value_ = (ValueHolder)&artifact.comments_;
            artifact.limit_ = (ptrdiff_t)&local_618;
            local_608._M_allocated_capacity = (size_type)&local_5f8;
            launchers._8_8_ = VVar64.string_;
            _Var63 = std::__detail::
                     _Hash_code_base<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::__detail::_Select1st,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                     ::_M_hash_code((_Hash_code_base<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::__detail::_Select1st,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                                     *)__key,(CompileData *)&local_618);
            uVar78 = _Var63 % (this->CompileGroupMap)._M_h._M_bucket_count;
            VVar96.map_ = (ObjectValues *)
                          std::
                          _Hashtable<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<(anonymous_namespace)::CompileData>,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          ::_M_find_node(&this_01->_M_h,uVar78,(key_type *)__key,_Var63);
            if ((__node_ptr)VVar96.int_ == (__node_ptr)0x0) {
              auVar99 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                  ((ulong)&(this->CompileGroupMap)._M_h._M_rehash_policy,
                                   (this->CompileGroupMap)._M_h._M_bucket_count,
                                   (this->CompileGroupMap)._M_h._M_element_count);
              __n_01 = auVar99._8_8_;
              if ((auVar99 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                __s = (this_01->_M_h)._M_buckets;
              }
              else {
                if (__n_01 == 1) {
                  *pp_Var4 = (__node_base_ptr)0x0;
                  __s = pp_Var4;
                }
                else {
                  __s = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::
                        allocate((allocator_type *)&obj_dir,__n_01);
                  memset(__s,0,__n_01 * 8);
                }
                _Var17._M_nxt = p_Var5->_M_nxt;
                p_Var5->_M_nxt = (_Hash_node_base *)0x0;
                uVar78 = 0;
LAB_00453522:
                uVar66 = uVar78;
                _Var75._M_nxt = _Var17._M_nxt;
                if (_Var75._M_nxt != (_Hash_node_base *)0x0) {
                  _Var17._M_nxt = (_Var75._M_nxt)->_M_nxt;
                  uVar78 = (ulong)_Var75._M_nxt[0x20]._M_nxt % __n_01;
                  if (__s[uVar78] == (_Hash_node_base *)0x0) goto LAB_00453554;
                  (_Var75._M_nxt)->_M_nxt = __s[uVar78]->_M_nxt;
                  pp_Var65 = &__s[uVar78]->_M_nxt;
                  uVar78 = uVar66;
                  goto LAB_00453573;
                }
                std::
                _Hashtable<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<(anonymous_namespace)::CompileData>,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::_M_deallocate_buckets(&this_01->_M_h);
                (this->CompileGroupMap)._M_h._M_bucket_count = __n_01;
                (this->CompileGroupMap)._M_h._M_buckets = __s;
                uVar78 = _Var63 % __n_01;
              }
              ((_Hash_node_code_cache<true> *)(VVar64.int_ + 0x100))->_M_hash_code = _Var63;
              if (__s[uVar78] == (_Hash_node_base *)0x0) {
                _Var17._M_nxt = p_Var5->_M_nxt;
                *(_Hash_node_base **)VVar64.string_ = _Var17._M_nxt;
                p_Var5->_M_nxt = (_Hash_node_base *)VVar64;
                if (_Var17._M_nxt != (_Hash_node_base *)0x0) {
                  ((ValueHolder *)
                  (__s + (ulong)_Var17._M_nxt[0x20]._M_nxt %
                         (this->CompileGroupMap)._M_h._M_bucket_count))->map_ =
                       (ObjectValues *)VVar64;
                  __s = (this->CompileGroupMap)._M_h._M_buckets;
                }
                __s[uVar78] = p_Var5;
              }
              else {
                *(_Hash_node_base **)VVar64.string_ = __s[uVar78]->_M_nxt;
                ((ValueHolder *)__s[uVar78])->map_ = (ObjectValues *)VVar64;
              }
              psVar7 = &(this->CompileGroupMap)._M_h._M_element_count;
              *psVar7 = *psVar7 + 1;
              launchers.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
              launchers._12_4_ = 0;
              VVar96.string_ = VVar64.string_;
            }
            std::
            _Hashtable<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<(anonymous_namespace)::CompileData>,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_Scoped_node::~_Scoped_node((_Scoped_node *)&launchers);
            launchers.value_.int_ = 0;
            Json::Value::Value((Value *)&launchers.bits_,arrayValue);
            pCVar68 = (this->CompileGroups).
                      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            launchers.value_ = VVar96;
            if (pCVar68 ==
                (this->CompileGroups).
                super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              __first_00 = (this->CompileGroups).
                           super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              lVar95 = (long)pCVar68 - (long)__first_00;
              if (lVar95 == 0x7fffffffffffffe0) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar66 = lVar95 / 0x30;
              __args_02 = (CompileGroup *)(lVar95 % 0x30);
              uVar78 = uVar66;
              if (pCVar68 == __first_00) {
                uVar78 = 1;
              }
              uVar92 = uVar78 + uVar66;
              __alloc_00 = (_Tp_alloc_type *)0x2aaaaaaaaaaaaaa;
              if (0x2aaaaaaaaaaaaa9 < uVar92) {
                uVar92 = 0x2aaaaaaaaaaaaaa;
              }
              if (CARRY8(uVar78,uVar66)) {
                uVar92 = 0x2aaaaaaaaaaaaaa;
              }
              if (uVar92 == 0) {
                __result_00 = (pointer)0x0;
              }
              else {
                __result_00 = (pointer)operator_new(uVar92 * 0x30);
                __args_02 = extraout_RDX_00;
              }
              std::allocator_traits<std::allocator<(anonymous_namespace)::Target::CompileGroup>>::
              construct<(anonymous_namespace)::Target::CompileGroup,(anonymous_namespace)::Target::CompileGroup>
                        ((allocator_type *)(__result_00 + uVar66),(CompileGroup *)&launchers,
                         __args_02);
              pCVar67 = std::
                        vector<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                        ::_S_relocate(__first_00,pCVar68,__result_00,__alloc_00);
              pCVar68 = std::
                        vector<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                        ::_S_relocate(pCVar68,pCVar68,pCVar67 + 1,__alloc_00);
              lVar95 = (long)(this->CompileGroups).
                             super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first_00;
              std::
              _Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ::_M_deallocate((_Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                               *)__first_00,(pointer)(lVar95 / 0x30),lVar95 % 0x30);
              (this->CompileGroups).
              super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ._M_impl.super__Vector_impl_data._M_start = __result_00;
              (this->CompileGroups).
              super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ._M_impl.super__Vector_impl_data._M_finish = pCVar68;
              (this->CompileGroups).
              super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = __result_00 + uVar92;
            }
            else {
              std::allocator_traits<std::allocator<(anonymous_namespace)::Target::CompileGroup>>::
              construct<(anonymous_namespace)::Target::CompileGroup,(anonymous_namespace)::Target::CompileGroup>
                        ((allocator_type *)pCVar68,(CompileGroup *)&launchers,__args_01);
              ppCVar8 = &(this->CompileGroups).
                         super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppCVar8 = *ppCVar8 + 1;
            }
            Json::Value::~Value((Value *)&launchers.bits_);
          }
          uVar11 = *(uint *)(VVar96.int_ + 0xf8);
          pCVar15 = (this->CompileGroups).
                    super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          Json::Value::Value(&launchers,value_00);
          Json::Value::append(&pCVar15[uVar11].SourceIndexes,&launchers);
          Json::Value::~Value(&launchers);
          value = *(UInt *)(VVar96.int_ + 0xf8);
          CompileData::~CompileData((CompileData *)&artifact);
          Json::Value::Value((Value *)&directoryEntries,value);
          pVVar36 = Json::Value::operator[]((Value *)&directories,"compileGroupIndex");
          Json::Value::operator=(pVVar36,(Value *)&directoryEntries);
          Json::Value::~Value((Value *)&directoryEntries);
        }
        std::__cxx11::string::~string((string *)&path);
        Json::Value::append(&local_2a8,(Value *)&directories);
        Json::Value::~Value((Value *)&directories);
      }
      pVVar36 = Json::Value::operator[](__return_storage_ptr__,"sources");
      Json::Value::operator=(pVVar36,&local_2a8);
      Json::Value::~Value(&local_2a8);
      Json::Value::Value((Value *)&objectSources,nullValue);
      pcVar74 = this->GT;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&artifact,"FOLDER",(allocator<char> *)&launchers);
      cVar40 = cmGeneratorTarget::GetProperty(pcVar74,(string *)&artifact);
      std::__cxx11::string::~string((string *)&artifact);
      if (cVar40.Value != (string *)0x0) {
        Json::Value::Value(&artifact,objectValue);
        Json::Value::operator=((Value *)&objectSources,&artifact);
        Json::Value::~Value(&artifact);
        Json::Value::Value(&artifact,cVar40.Value);
        pVVar36 = Json::Value::operator[]((Value *)&objectSources,"name");
        Json::Value::operator=(pVVar36,&artifact);
        Json::Value::~Value(&artifact);
      }
      bVar31 = Json::Value::isNull((Value *)&objectSources);
      if (!bVar31) {
        pVVar36 = Json::Value::operator[](__return_storage_ptr__,"folder");
        Json::Value::operator=(pVVar36,(Value *)&objectSources);
      }
      Json::Value::Value(&sourceGroups,arrayValue);
      pSVar18 = (this->SourceGroups).
                super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pSVar85 = (this->SourceGroups).
                     super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                     ._M_impl.super__Vector_impl_data._M_start; pSVar85 != pSVar18;
          pSVar85 = pSVar85 + 1) {
        Json::Value::Value(&launchers,objectValue);
        Json::Value::Value(&artifact,&pSVar85->Name);
        pVVar36 = Json::Value::operator[](&launchers,"name");
        Json::Value::operator=(pVVar36,&artifact);
        Json::Value::~Value(&artifact);
        pVVar36 = Json::Value::operator[](&launchers,"sourceIndexes");
        Json::Value::operator=(pVVar36,&pSVar85->SourceIndexes);
        Json::Value::append(&sourceGroups,&launchers);
        Json::Value::~Value(&launchers);
      }
      bVar31 = Json::Value::empty(&sourceGroups);
      if (!bVar31) {
        pVVar36 = Json::Value::operator[](__return_storage_ptr__,"sourceGroups");
        Json::Value::operator=(pVVar36,&sourceGroups);
      }
      Json::Value::Value(&compileGroups,arrayValue);
      VVar96 = (ValueHolder)
               (this->CompileGroups).
               super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar15 = (this->CompileGroups).
                super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (VVar96 == pCVar15) {
          bVar31 = Json::Value::empty(&compileGroups);
          if (!bVar31) {
            pVVar36 = Json::Value::operator[](__return_storage_ptr__,"compileGroups");
            Json::Value::operator=(pVVar36,&compileGroups);
          }
          Json::Value::~Value(&compileGroups);
          Json::Value::~Value(&sourceGroups);
          Json::Value::~Value((Value *)&objectSources);
          std::
          pair<Json::Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
          ::~pair((pair<Json::Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                   *)&p);
          BacktraceData::Dump(&artifact,&this->Backtraces);
          pVVar36 = Json::Value::operator[](__return_storage_ptr__,"backtraceGraph");
          Json::Value::operator=(pVVar36,&artifact);
          Json::Value::~Value(&artifact);
          Json::Value::~Value(&dependencies);
          return __return_storage_ptr__;
        }
        lVar95 = *(long *)VVar96.string_;
        VVar64 = VVar96;
        CompileData::CompileData((CompileData *)&artifact);
        std::__cxx11::string::_M_assign((string *)&artifact);
        if (artifact._8_8_ != 0) {
          iVar43 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                   ::lower_bound(this_00,(key_type *)&artifact);
          if (((_Rb_tree_header *)iVar43._M_node == p_Var2) ||
             (bVar31 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&artifact,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(iVar43._M_node + 1)), bVar31)) {
            std::__throw_out_of_range("map::at");
          }
          std::__cxx11::string::_M_assign((string *)&artifact.limit_);
          if ((__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)&iVar43._M_node[7]._M_parent != &local_5a0) {
            __first_01._M_current =
                 (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)iVar43._M_node[7]._M_parent;
            __last._M_current =
                 (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)iVar43._M_node[7]._M_left;
            __n_05 = (allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)__last._M_current - (long)__first_01._M_current);
            paVar76 = (allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)local_590 - (long)local_5a0._M_current);
            if (paVar76 < __n_05) {
              pJVar69 = std::
                        _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::_M_allocate((_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)((long)__n_05 / 0x28),(size_t)__n_05);
              std::
              __uninitialized_copy_a<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,(anonymous_namespace)::JBT<std::__cxx11::string>*,(anonymous_namespace)::JBT<std::__cxx11::string>>
                        (__first_01,__last,pJVar69,paVar76);
              std::_Destroy<(anonymous_namespace)::JBT<std::__cxx11::string>*>
                        (local_5a0._M_current,pJStack_598);
              std::
              _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::_M_deallocate((_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_5a0._M_current,
                              (pointer)(((long)local_590 - (long)local_5a0._M_current) / 0x28),
                              ((long)local_590 - (long)local_5a0._M_current) % 0x28);
              local_590 = (pointer)((long)pJVar69 + (long)__n_05);
              local_5a0._M_current = pJVar69;
            }
            else if ((allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)pJStack_598 - (long)local_5a0._M_current) < __n_05) {
              _Var72._M_current = local_5a0._M_current;
              for (lVar71 = ((long)pJStack_598 - (long)local_5a0._M_current) / 0x28; 0 < lVar71;
                  lVar71 = lVar71 + -1) {
                JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator=(_Var72._M_current,__first_01._M_current);
                __first_01._M_current = __first_01._M_current + 1;
                _Var72._M_current = _Var72._M_current + 1;
              }
              pJVar19 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)iVar43._M_node[7]._M_left;
              pJVar69 = pJStack_598;
              for (pJVar89 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)(((long)pJStack_598 - (long)local_5a0._M_current) +
                                (long)iVar43._M_node[7]._M_parent); pJVar89 != pJVar19;
                  pJVar89 = pJVar89 + 1) {
                JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::JBT(pJVar69,pJVar89);
                pJVar69 = pJVar69 + 1;
              }
            }
            else {
              _Var72 = std::
                       copy<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>>
                                 (__first_01,__last,local_5a0);
              pJVar69 = pJStack_598;
              for (; _Var72._M_current != pJVar69; _Var72._M_current = _Var72._M_current + 1) {
                std::__cxx11::string::~string((string *)_Var72._M_current);
              }
            }
            pJStack_598 = (pointer)(__n_05 + (long)local_5a0._M_current);
          }
          __n_06 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(iVar43._M_node + 4);
          std::__cxx11::string::_M_assign((string *)local_608._M_local_buf);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(iVar43._M_node + 4) != &local_608) {
            p_Var42 = *(_Base_ptr *)(iVar43._M_node + 5);
            p_Var87 = iVar43._M_node[5]._M_parent;
            uVar78 = (long)p_Var87 - (long)p_Var42;
            if ((ulong)((long)local_5d8 - (long)local_5e8) < uVar78) {
              p_Var70 = (_Base_ptr)
                        std::
                        _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                        ::_M_allocate((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                                       *)((long)uVar78 >> 2),(size_t)__n_06);
              for (lVar71 = 0; p_Var9 = (_Base_ptr)((long)&p_Var42->_M_color + lVar71),
                  p_Var9 != p_Var87; lVar71 = lVar71 + 4) {
                *(_Rb_tree_color *)
                 ((long)&(((_Vector_impl *)&p_Var70->_M_color)->super__Vector_impl_data)._M_start +
                 lVar71) = p_Var9->_M_color;
              }
              std::
              _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
              ::_M_deallocate((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                               *)local_5e8,(pointer)((long)local_5d8 - (long)local_5e8 >> 2),__n_02)
              ;
              local_5d8 = (_Hash_node_base *)((long)p_Var70 + uVar78);
              local_5e8 = p_Var70;
            }
            else {
              __n_03 = (long)p_Stack_5e0 - (long)local_5e8;
              if (__n_03 < uVar78) {
                if (p_Stack_5e0 != local_5e8) {
                  memmove(local_5e8,p_Var42,__n_03);
                  p_Var42 = *(_Base_ptr *)(iVar43._M_node + 5);
                  p_Var87 = iVar43._M_node[5]._M_parent;
                  __n_03 = (long)p_Stack_5e0 - (long)local_5e8;
                }
                for (p_Var42 = (_Base_ptr)((long)&p_Var42->_M_color + __n_03); p_Var42 != p_Var87;
                    p_Var42 = (_Base_ptr)&p_Var42->field_0x4) {
                  *(_Rb_tree_color *)
                   &(((_Vector_impl *)&p_Stack_5e0->_M_color)->super__Vector_impl_data)._M_start =
                       p_Var42->_M_color;
                  p_Stack_5e0 = (_Base_ptr)&p_Stack_5e0->field_0x4;
                }
              }
              else if (p_Var87 != p_Var42) {
                memmove(local_5e8,p_Var42,uVar78);
              }
            }
            p_Stack_5e0 = (_Base_ptr)((long)local_5e8 + uVar78);
          }
          std::
          vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::reserve(&local_5d0,
                    (*(long *)(iVar43._M_node + 6) - (long)iVar43._M_node[5]._M_right) / 0x28 +
                    (*(long *)(lVar95 + 0x88) - *(long *)(lVar95 + 0x80)) / 0x28);
          std::
          vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
          ::
          insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                    ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                      *)&local_5d0,
                     (const_iterator)
                     local_5d0.
                     super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)iVar43._M_node[5]._M_right,
                     *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       **)(iVar43._M_node + 6));
          std::
          vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
          ::
          insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                    ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                      *)&local_5d0,
                     (const_iterator)
                     local_5d0.
                     super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       **)(lVar95 + 0x80),
                     *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       **)(lVar95 + 0x88));
          std::
          vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
          ::reserve(&local_588,
                    (*(long *)(lVar95 + 0xd0) - *(long *)(lVar95 + 200)) / 0x30 +
                    ((long)iVar43._M_node[8]._M_parent - *(long *)(iVar43._M_node + 8)) / 0x30);
          std::
          vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
          ::
          insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                    ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                      *)&local_588,
                     (const_iterator)
                     local_588.
                     super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,*(IncludeEntry **)(lVar95 + 200),
                     *(IncludeEntry **)(lVar95 + 0xd0));
          std::
          vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
          ::
          insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                    ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                      *)&local_588,
                     (const_iterator)
                     local_588.
                     super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     *(IncludeEntry **)(iVar43._M_node + 8),
                     (IncludeEntry *)iVar43._M_node[8]._M_parent);
          std::
          vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
          ::reserve(&local_570,
                    (*(long *)(lVar95 + 0xe8) - *(long *)(lVar95 + 0xe0)) / 0x30 +
                    (*(long *)(iVar43._M_node + 9) - (long)iVar43._M_node[8]._M_right) / 0x30);
          std::
          vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
          ::
          insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                    ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                      *)&local_570,
                     (const_iterator)
                     local_570.
                     super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,*(IncludeEntry **)(lVar95 + 0xe0),
                     *(IncludeEntry **)(lVar95 + 0xe8));
          std::
          vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
          ::
          insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                    ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                      *)&local_570,
                     (const_iterator)
                     local_570.
                     super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (IncludeEntry *)iVar43._M_node[8]._M_right,
                     *(IncludeEntry **)(iVar43._M_node + 9));
          std::
          vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::reserve(&local_5b8,
                    ((long)iVar43._M_node[6]._M_right - (long)iVar43._M_node[6]._M_left) / 0x28 +
                    (*(long *)(lVar95 + 0xa0) - *(long *)(lVar95 + 0x98)) / 0x28);
          std::
          vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
          ::
          insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                    ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                      *)&local_5b8,
                     (const_iterator)
                     local_5b8.
                     super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)iVar43._M_node[6]._M_left,
                     (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)iVar43._M_node[6]._M_right);
          VVar64 = *(ValueHolder *)(lVar95 + 0xa0);
          std::
          vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
          ::
          insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                    ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                      *)&local_5b8,
                     (const_iterator)
                     local_5b8.
                     super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       **)(lVar95 + 0x98),
                     (__normal_iterator<const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      )VVar64);
          pJVar86 = local_5b8.
                    super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pJVar69 = local_5b8.
                    super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_5b8.
              super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_5b8.
              super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            VVar64.int_ = 2;
            launchers.value_.int_ =
                 (((long)local_5b8.
                         super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_5b8.
                        super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x28 + 1) / 2;
            launchers.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
            launchers._12_4_ = 0;
            launchers.comments_.ptr_._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl =
                 (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                    )0x0;
            VVar73.int_ = launchers.value_.int_;
LAB_00454059:
            if (VVar73 < 1) {
              std::
              __inplace_stable_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)((anonymous_namespace)::JBT<std::__cxx11::string>const&,(anonymous_namespace)::JBT<std::__cxx11::string>const&)>>
                        ((__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          )pJVar69,
                         (__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          )pJVar86,
                         (_Iter_comp_iter<bool_(*)(const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                          )0x4582ce);
            }
            else {
              uVar78 = VVar73.int_ * 0x28;
              this_06._M_t.
              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              .
              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
              ._M_head_impl =
                   (tuple<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                    )operator_new(uVar78,(nothrow_t *)&std::nothrow);
              if ((__uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                   )this_06._M_t.
                    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                    .
                    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                   )0x0) goto code_r0x00454076;
              JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::JBT((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_06._M_t.
                       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                       .
                       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                       ._M_head_impl,pJVar69);
              _Var91._M_t.
              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              .
              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
              ._M_head_impl =
                   this_06._M_t.
                   super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                   .
                   super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                   ._M_head_impl;
              while (uVar78 = uVar78 - 0x28, uVar78 != 0) {
                JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::JBT((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)_Var91._M_t.
                                super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                .
                                super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                ._M_head_impl + 0x28),
                      (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)_Var91._M_t.
                         super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                         .
                         super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                         ._M_head_impl);
                _Var91._M_t.
                super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                .
                super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                ._M_head_impl =
                     (tuple<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                      )(tuple<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                        )((long)_Var91._M_t.
                                super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                .
                                super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                ._M_head_impl + 0x28);
              }
              JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator=(pJVar69,(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)_Var91._M_t.
                                     super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                     .
                                     super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                     ._M_head_impl);
              launchers._8_8_ = VVar73;
              launchers.comments_.ptr_._M_t.
              super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              .
              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
              ._M_head_impl =
                   (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                    )(unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                      )this_06._M_t.
                       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                       .
                       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                       ._M_head_impl;
              std::
              __stable_sort_adaptive<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,(anonymous_namespace)::JBT<std::__cxx11::string>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)((anonymous_namespace)::JBT<std::__cxx11::string>const&,(anonymous_namespace)::JBT<std::__cxx11::string>const&)>>
                        ((__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          )pJVar69,
                         (__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          )pJVar86,
                         (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)this_06._M_t.
                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            .
                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                            ._M_head_impl,VVar73.int_,
                         (_Iter_comp_iter<bool_(*)(const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                          )0x4582ce);
              VVar64 = VVar73;
            }
            std::
            _Temporary_buffer<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Temporary_buffer
                      ((_Temporary_buffer<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&launchers);
            pJVar24 = local_5b8.
                      super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pJVar69 = local_5b8.
                      super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pJVar86 = local_5b8.
                      super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_5b8.
                super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_5b8.
                super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                pJVar61 = pJVar86;
                pJVar86 = pJVar61 + 1;
                pJVar69 = pJVar24;
                if (pJVar86 == pJVar24) goto LAB_0045418e;
                _Var32 = std::operator==(&pJVar61->Value,&pJVar86->Value);
              } while (!_Var32);
              while (pJVar86 = pJVar86 + 1, pJVar86 != pJVar24) {
                _Var32 = std::operator==(&pJVar61->Value,&pJVar86->Value);
                if (!_Var32) {
                  pJVar61 = pJVar61 + 1;
                  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator=(pJVar61,pJVar86);
                }
              }
              pJVar69 = pJVar61 + 1;
            }
          }
LAB_0045418e:
          if (pJVar69 !=
              local_5b8.
              super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::_Destroy<(anonymous_namespace)::JBT<std::__cxx11::string>*>
                      (pJVar69,local_5b8.
                               super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
            local_5b8.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pJVar69;
          }
        }
        Json::Value::Value((Value *)&installGens,objectValue);
        if (artifact._8_8_ != 0) {
          Json::Value::Value(&launchers,(String *)&artifact);
          pVVar36 = Json::Value::operator[]((Value *)&installGens,"language");
          Json::Value::operator=(pVVar36,&launchers);
          Json::Value::~Value(&launchers);
        }
        if (local_5d0.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_5d0.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          Json::Value::Value((Value *)&obj_dir,arrayValue);
          pJVar69 = local_5d0.
                    super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pTVar57 = (Target *)
                         local_5d0.
                         super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pTVar57 != (Target *)pJVar69;
              pTVar57 = (Target *)((pTVar57->TopSource).field_2._M_local_buf + 8)) {
            fsJson.value_.string_ = (char *)&fsJson.comments_;
            fsJson.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
            fsJson._12_4_ = 0;
            fsJson.comments_.ptr_._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl =
                 (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  )((ulong)fsJson.comments_.ptr_._M_t.
                           super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                           .
                           super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                           ._M_head_impl & 0xffffffffffffff00);
            DumpCommandFragment(&launchers,pTVar57,
                                (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&fsJson,(string *)VVar64.map_);
            Json::Value::append((Value *)&obj_dir,&launchers);
            Json::Value::~Value(&launchers);
            std::__cxx11::string::~string((string *)&fsJson);
          }
          pVVar36 = Json::Value::operator[]((Value *)&installGens,"compileCommandFragments");
          Json::Value::operator=(pVVar36,(Value *)&obj_dir);
          Json::Value::~Value((Value *)&obj_dir);
        }
        if (local_588.
            super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_588.
            super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          Json::Value::Value(&launchers,arrayValue);
          pIVar25 = local_588.
                    super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pIVar79 = extraout_RDX_01;
          for (pTVar57 = (Target *)
                         local_588.
                         super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start; pTVar57 != (Target *)pIVar25;
              pTVar57 = (Target *)&pTVar57->TopBuild) {
            DumpInclude((Value *)&obj_dir,pTVar57,pIVar79);
            Json::Value::append(&launchers,(Value *)&obj_dir);
            Json::Value::~Value((Value *)&obj_dir);
            pIVar79 = extraout_RDX_02;
          }
          pVVar36 = Json::Value::operator[]((Value *)&installGens,"includes");
          Json::Value::operator=(pVVar36,&launchers);
          Json::Value::~Value(&launchers);
        }
        if (local_570.
            super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_570.
            super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          Json::Value::Value(&launchers,arrayValue);
          pIVar25 = local_570.
                    super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pIVar79 = extraout_RDX_03;
          for (pTVar57 = (Target *)
                         local_570.
                         super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start; pTVar57 != (Target *)pIVar25;
              pTVar57 = (Target *)&pTVar57->TopBuild) {
            DumpInclude((Value *)&obj_dir,pTVar57,pIVar79);
            Json::Value::append(&launchers,(Value *)&obj_dir);
            Json::Value::~Value((Value *)&obj_dir);
            pIVar79 = extraout_RDX_04;
          }
          pVVar36 = Json::Value::operator[]((Value *)&installGens,"frameworks");
          Json::Value::operator=(pVVar36,&launchers);
          Json::Value::~Value(&launchers);
        }
        if (local_5b8.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_5b8.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          Json::Value::Value((Value *)&obj_dir,arrayValue);
          pJVar69 = local_5b8.
                    super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pJVar86 = local_5b8.
                         super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pJVar86 != pJVar69;
              pJVar86 = pJVar86 + 1) {
            Json::Value::Value(&fsJson,objectValue);
            Json::Value::Value(&launchers,&pJVar86->Value);
            pVVar36 = Json::Value::operator[](&fsJson,"define");
            Json::Value::operator=(pVVar36,&launchers);
            Json::Value::~Value(&launchers);
            AddBacktrace((Target *)&fsJson,(Value *)(ulong)(pJVar86->Backtrace).Index,bt);
            Json::Value::append((Value *)&obj_dir,&fsJson);
            Json::Value::~Value(&fsJson);
          }
          pVVar36 = Json::Value::operator[]((Value *)&installGens,"defines");
          Json::Value::operator=(pVVar36,(Value *)&obj_dir);
          Json::Value::~Value((Value *)&obj_dir);
        }
        if (local_5a0._M_current != pJStack_598) {
          Json::Value::Value((Value *)&obj_dir,arrayValue);
          pJVar69 = pJStack_598;
          for (_Var72._M_current = local_5a0._M_current; _Var72._M_current != pJVar69;
              _Var72._M_current = _Var72._M_current + 1) {
            Json::Value::Value(&fsJson,objectValue);
            Json::Value::Value(&launchers,&(_Var72._M_current)->Value);
            pVVar36 = Json::Value::operator[](&fsJson,"header");
            Json::Value::operator=(pVVar36,&launchers);
            Json::Value::~Value(&launchers);
            AddBacktrace((Target *)&fsJson,(Value *)(ulong)((_Var72._M_current)->Backtrace).Index,
                         bt_00);
            Json::Value::append((Value *)&obj_dir,&fsJson);
            Json::Value::~Value(&fsJson);
          }
          pVVar36 = Json::Value::operator[]((Value *)&installGens,"precompileHeaders");
          Json::Value::operator=(pVVar36,(Value *)&obj_dir);
          Json::Value::~Value((Value *)&obj_dir);
        }
        if ((_Hash_node_base *)local_608._8_8_ != (_Hash_node_base *)0x0) {
          Json::Value::Value(&fsJson,objectValue);
          Json::Value::Value(&launchers,(String *)&local_608);
          pVVar36 = Json::Value::operator[](&fsJson,"standard");
          Json::Value::operator=(pVVar36,&launchers);
          Json::Value::~Value(&launchers);
          if (local_5e8 != p_Stack_5e0) {
            Json::Value::Value(&launchers,arrayValue);
            p_Var42 = p_Stack_5e0;
            for (p_Var87 = local_5e8; p_Var87 != p_Var42; p_Var87 = (_Base_ptr)&p_Var87->field_0x4)
            {
              Json::Value::Value((Value *)&obj_dir,
                                 *(UInt *)&(((_Vector_impl *)&p_Var87->_M_color)->
                                           super__Vector_impl_data)._M_start);
              Json::Value::append(&launchers,(Value *)&obj_dir);
              Json::Value::~Value((Value *)&obj_dir);
            }
            pVVar36 = Json::Value::operator[](&fsJson,"backtraces");
            Json::Value::operator=(pVVar36,&launchers);
            Json::Value::~Value(&launchers);
          }
          pVVar36 = Json::Value::operator[]((Value *)&installGens,"languageStandard");
          Json::Value::operator=(pVVar36,&fsJson);
          Json::Value::~Value(&fsJson);
        }
        CompileData::~CompileData((CompileData *)&artifact);
        pVVar36 = Json::Value::operator[]((Value *)&installGens,"sourceIndexes");
        Json::Value::operator=
                  (pVVar36,(Value *)&((VVar96.map_)->_M_t)._M_impl.super__Rb_tree_header);
        Json::Value::append(&compileGroups,(Value *)&installGens);
        Json::Value::~Value((Value *)&installGens);
        VVar96.string_ = (char *)(VVar96.int_ + 0x30);
      } while( true );
    }
    p_Var50 = (_Rb_tree_node_base *)(uVar48 + 0x20);
    iVar43 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
             ::lower_bound(this_00,(key_type *)p_Var50);
    pVar20.second = iVar43._M_node;
    pVar20.first = iVar43._M_node;
    if (((_Rb_tree_header *)iVar43._M_node == p_Var2) ||
       (bVar31 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )p_Var50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(iVar43._M_node + 1)), bVar31)) {
      p_Var44 = (_Rb_tree_node_base *)operator_new(0x130);
      __rhs = (_Link_type)(p_Var44 + 1);
      std::__cxx11::string::string((string *)__rhs,(string *)p_Var50);
      memset((CompileData *)(p_Var44 + 2),0,0xf0);
      CompileData::CompileData((CompileData *)(p_Var44 + 2));
      if ((_Rb_tree_header *)iVar43._M_node == p_Var2) {
        if (((this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
           (__p_00 = __rhs,
           bVar31 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header.
                                       _M_header._M_right + 1),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__rhs), !bVar31)) {
LAB_004512c6:
          __p_00 = __rhs;
          pVar97 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                   ::_M_get_insert_unique_pos(&this_00->_M_t,(key_type *)__rhs);
        }
        else {
          p_Var77 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
LAB_004512c0:
          auVar99._8_8_ = 0;
          auVar99._0_8_ = p_Var77;
          pVar97 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar99 << 0x40);
        }
LAB_004512d9:
        iVar43._M_node = pVar97.first;
        if (pVar97.second == (_Rb_tree_node_base *)0x0) {
LAB_0045130b:
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
          ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                          *)p_Var44,__p_00);
          goto LAB_0045134a;
        }
      }
      else {
        __rhs_00 = (_Link_type)(iVar43._M_node + 1);
        __p_00 = __rhs_00;
        bVar31 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__rhs_00);
        if (!bVar31) {
          __p_00 = __rhs;
          bVar31 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__rhs_00,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__rhs);
          if (bVar31) {
            p_Var77 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            if (p_Var77 == iVar43._M_node) goto LAB_004512c0;
            p_Var45 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar43._M_node);
            pVar97.second = p_Var45;
            pVar97.first = p_Var45;
            __p_00 = (_Link_type)(p_Var45 + 1);
            bVar31 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)__p_00);
            if (!bVar31) goto LAB_004512c6;
            if ((iVar43._M_node)->_M_right == (_Base_ptr)0x0) goto LAB_004512ba;
            goto LAB_004512d9;
          }
          goto LAB_0045130b;
        }
        p_Var77 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pVar97.second = p_Var77;
        pVar97.first = p_Var77;
        if (p_Var77 == iVar43._M_node) goto LAB_004512d9;
        iVar43._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar43._M_node);
        __p_00 = __rhs;
        bVar31 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(iVar43._M_node + 1),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__rhs);
        if (!bVar31) goto LAB_004512c6;
        pVar97 = pVar20;
        if ((iVar43._M_node)->_M_right != (_Base_ptr)0x0) goto LAB_004512d9;
LAB_004512ba:
        auVar21._8_8_ = 0;
        auVar21._0_8_ = iVar43._M_node;
        pVar97 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar21 << 0x40);
      }
      p_Var45 = pVar97.second;
      bVar31 = true;
      if ((p_Var2 != (_Rb_tree_header *)p_Var45) && (pVar97.first == (_Rb_tree_node_base *)0x0)) {
        bVar31 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(p_Var45 + 1));
      }
      std::_Rb_tree_insert_and_rebalance(bVar31,p_Var44,p_Var45,&p_Var2->_M_header);
      psVar3 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *psVar3 = *psVar3 + 1;
      iVar43._M_node = p_Var44;
    }
LAB_0045134a:
    std::__cxx11::string::_M_assign((string *)(iVar43._M_node + 2));
    pcVar12 = this->GT->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&artifact,"CMAKE_SYSROOT_COMPILE",(allocator<char> *)&launchers);
    cVar40 = cmMakefile::GetDefinition(pcVar12,(string *)&artifact);
    std::__cxx11::string::~string((string *)&artifact);
    if (cVar40.Value == (string *)0x0) {
      pcVar12 = this->GT->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&artifact,"CMAKE_SYSROOT",(allocator<char> *)&launchers);
      cVar40 = cmMakefile::GetDefinition(pcVar12,(string *)&artifact);
      std::__cxx11::string::~string((string *)&artifact);
      if (cVar40.Value != (string *)0x0) goto LAB_004513d2;
    }
    else {
LAB_004513d2:
      std::__cxx11::string::_M_assign((string *)(iVar43._M_node + 3));
    }
    pcVar37 = cmGeneratorTarget::GetLocalGenerator(this->GT);
    artifact.value_.string_ = (char *)&artifact.comments_;
    artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
    artifact._12_4_ = 0;
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          )((ulong)artifact.comments_.ptr_._M_t.
                   super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                   .
                   super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                   ._M_head_impl & 0xffffffffffffff00);
    cmLocalGenerator::GetTargetCompileFlags
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&launchers,pcVar37,this->GT,this->Config,(string *)p_Var50,(string *)&artifact);
    std::__cxx11::string::~string((string *)&artifact);
    std::
    vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&iVar43._M_node[5]._M_right,(launchers._8_8_ - (long)launchers.value_) / 0x30);
    uVar27 = launchers._8_8_;
    for (VVar96 = launchers.value_; VVar96.int_ != uVar27;
        VVar96.string_ = (char *)(VVar96.int_ + 0x30)) {
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact,this,
                 (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)VVar96.map_);
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
      ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                  *)&iVar43._M_node[5]._M_right,
                 (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact);
      std::__cxx11::string::~string((string *)&artifact);
    }
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&launchers);
    cmLocalGenerator::GetTargetDefines
              ((set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&launchers,pcVar37,this->GT,this->Config,(string *)p_Var50);
    std::
    vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&iVar43._M_node[6]._M_left,(size_type)local_4f0._M_p);
    for (p_Var44 = (_Rb_tree_node_base *)launchers.start_;
        p_Var44 != (_Rb_tree_node_base *)&launchers.bits_;
        p_Var44 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var44)) {
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact,this,
                 (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(p_Var44 + 1));
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
      ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                  *)&iVar43._M_node[6]._M_left,
                 (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact);
      std::__cxx11::string::~string((string *)&artifact);
    }
    cmLocalGenerator::GetIncludeDirectories
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&objectSources,pcVar37,this->GT,(string *)p_Var50,this->Config);
    ppcVar28 = objectSources.
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    for (pBVar80 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)objectSources.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        pBVar80 !=
        (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        ppcVar28; pBVar80 = pBVar80 + 1) {
      bVar31 = cmGeneratorTarget::IsApple(this->GT);
      if ((bVar31) && (bVar31 = cmSystemTools::IsPathToFramework(&pBVar80->Value), bVar31)) {
        (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                  ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&artifact,this,pBVar80);
        bVar31 = cmGeneratorTarget::IsSystemIncludeDirectory
                           (this->GT,&pBVar80->Value,this->Config,(string *)p_Var50);
        obj_dir._M_dataplus._M_p._0_1_ = bVar31;
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
        ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>,bool>
                  ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                    *)&iVar43._M_node[8]._M_right,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&artifact,(bool *)&obj_dir);
      }
      else {
        (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                  ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&artifact,this,pBVar80);
        bVar31 = cmGeneratorTarget::IsSystemIncludeDirectory
                           (this->GT,&pBVar80->Value,this->Config,(string *)p_Var50);
        obj_dir._M_dataplus._M_p._0_1_ = bVar31;
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
        ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>,bool>
                  ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                    *)(iVar43._M_node + 8),
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&artifact,(bool *)&obj_dir);
      }
      std::__cxx11::string::~string((string *)&artifact);
    }
    cmGeneratorTarget::GetPrecompileHeaders
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&sourceGroups,this->GT,this->Config,(string *)p_Var50);
    uVar27 = sourceGroups._8_8_;
    for (VVar96 = sourceGroups.value_; VVar96.int_ != uVar27;
        VVar96.string_ = (char *)(VVar96.int_ + 0x30)) {
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact,this,
                 (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)VVar96.map_);
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
      ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                  *)&iVar43._M_node[7]._M_parent,
                 (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact);
      std::__cxx11::string::~string((string *)&artifact);
    }
    __n = cmGeneratorTarget::GetLanguageStandardProperty(this->GT,(string *)p_Var50,this->Config);
    if (__n != (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0) {
      fsJson.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl =
           (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
              )0x0;
      fsJson.value_.int_ = 0;
      fsJson.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
      fsJson._12_4_ = 0;
      bt_01 = (__n->Backtraces).
              super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
              super__Vector_impl_data._M_start;
      local_6c0 = (__n->Backtraces).
                  super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      p_Var94 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                 *)((long)local_6c0 - (long)bt_01 >> 4);
      if ((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
           *)0x1fffffffffffffff < p_Var94) {
        std::__throw_length_error("vector::reserve");
      }
      VVar96 = (ValueHolder)fsJson._8_8_;
      local_6d0._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl =
           (tuple<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            )(tuple<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              )fsJson.comments_.ptr_._M_t.
               super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
               .
               super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
               ._M_head_impl;
      VVar64 = (ValueHolder)fsJson._8_8_;
      if (local_6c0 != bt_01) {
        fsJson._8_8_ = std::
                       _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                       ::_M_allocate(p_Var94,(size_t)bt_01);
        local_6d0._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl =
             (tuple<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              )(fsJson._8_8_ + (long)p_Var94 * 4);
        bt_01 = (__n->Backtraces).
                super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                _M_impl.super__Vector_impl_data._M_start;
        local_6c0 = (__n->Backtraces).
                    super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        VVar96.map_ = (ObjectValues *)fsJson._8_8_;
        VVar64.map_ = (ObjectValues *)fsJson._8_8_;
        fsJson.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl =
             (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              )(unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                )local_6d0._M_t.
                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                 .
                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                 ._M_head_impl;
      }
      for (; fsJson.value_ = VVar64, uVar27 = fsJson._8_8_, bt_01 != local_6c0; bt_01 = bt_01 + 1) {
        __n_04 = bt_01;
        JVar34 = BacktraceData::Add(&this->Backtraces,bt_01);
        if ((tuple<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
             )uVar27 ==
            (_Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
             )local_6d0._M_t.
              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              .
              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
              ._M_head_impl) {
          lVar95 = uVar27 - (long)VVar96;
          if (lVar95 == 0x7ffffffffffffffc) {
            fsJson.comments_.ptr_._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl =
                 (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  )(unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                    )local_6d0._M_t.
                     super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                     .
                     super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                     ._M_head_impl;
            fsJson.value_ = VVar96;
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          __p = (pointer)(lVar95 >> 2);
          pJVar46 = __p;
          if (uVar27 == VVar96.int_) {
            pJVar46 = (pointer)&DAT_00000001;
          }
          p_Var94 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                     *)((long)&__p->Index + (long)&pJVar46->Index);
          if ((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
               *)0x1ffffffffffffffe < p_Var94) {
            p_Var94 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                       *)0x1fffffffffffffff;
          }
          if (CARRY8((ulong)pJVar46,(ulong)__p)) {
            p_Var94 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                       *)0x1fffffffffffffff;
          }
          VVar47.map_ = (ObjectValues *)
                        std::
                        _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                        ::_M_allocate(p_Var94,(size_t)__n_04);
          *(ArrayIndex *)(VVar47.string_ + lVar95) = JVar34.Index;
          VVar64.map_ = VVar47.map_;
          for (VVar73 = VVar96; VVar81.string_ = (char *)(VVar64.int_ + 4), VVar73.int_ != uVar27;
              VVar73.string_ = &((VVar73.map_)->_M_t)._M_impl.field_0x4) {
            *(ArrayIndex *)VVar64.string_ = *(ArrayIndex *)VVar73.string_;
            VVar64.string_ = VVar81.string_;
          }
          std::
          _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
          ::_M_deallocate((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                           *)VVar96.map_,__p,__n_00);
          local_6d0._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl =
               (tuple<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                )((long)VVar47.string_ + (long)p_Var94 * 4);
        }
        else {
          *(ArrayIndex *)uVar27 = JVar34.Index;
          VVar81.string_ = (char *)(uVar27 + 4);
          VVar47 = VVar96;
        }
        VVar96 = VVar47;
        VVar64 = fsJson.value_;
        fsJson._8_8_ = VVar81;
      }
      fsJson.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl =
           (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            )(unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              )local_6d0._M_t.
               super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
               .
               super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
               ._M_head_impl;
      fsJson.value_ = VVar96;
      std::__cxx11::string::string((string *)&obj_dir,(string *)__n);
      installGens.
      super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      installGens.
      super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)std::
                    _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                    ::_M_allocate((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                                   *)(uVar27 - (long)VVar96 >> 2),(size_t)__n);
      installGens.
      super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((uVar27 - (long)VVar96) +
                    (long)installGens.
                          super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      installGens.
      super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           installGens.
           super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
      for (; VVar96.int_ != uVar27; VVar96.string_ = &((VVar96.map_)->_M_t)._M_impl.field_0x4) {
        ((pointer)
        installGens.
        super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
        _M_impl.super__Vector_impl_data._M_finish)->Index = *(ArrayIndex *)VVar96.string_;
        installGens.
        super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)installGens.
                             super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4);
      }
      JBTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::JBTs
                ((JBTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact,&obj_dir,
                 (vector<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                  *)&installGens);
      std::
      _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
      ::~_Vector_base((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                       *)&installGens);
      std::__cxx11::string::~string((string *)&obj_dir);
      std::
      _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
      ::~_Vector_base((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                       *)&fsJson);
      std::__cxx11::string::operator=((string *)(iVar43._M_node + 4),(string *)&artifact);
      obj_dir.field_2._M_allocated_capacity = (size_type)iVar43._M_node[5]._M_left;
      iVar43._M_node[5]._M_left = (_Base_ptr)local_618._M_allocated_capacity;
      obj_dir._M_dataplus._M_p = *(pointer *)(iVar43._M_node + 5);
      obj_dir._M_string_length = (size_type)iVar43._M_node[5]._M_parent;
      *(ptrdiff_t *)(iVar43._M_node + 5) = artifact.limit_;
      iVar43._M_node[5]._M_parent = p_Stack_620;
      artifact.limit_ = 0;
      p_Stack_620 = (_Base_ptr)0x0;
      local_618._M_allocated_capacity = 0;
      std::
      _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
      ::~_Vector_base((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                       *)&obj_dir);
      JBTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~JBTs
                ((JBTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&artifact);
    }
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&sourceGroups);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&objectSources);
    std::
    _Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&launchers);
    uVar48 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar48);
  } while( true );
LAB_00453554:
  (_Var75._M_nxt)->_M_nxt = p_Var5->_M_nxt;
  p_Var5->_M_nxt = _Var75._M_nxt;
  __s[uVar78] = p_Var5;
  if ((_Var75._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var65 = __s + uVar66;
LAB_00453573:
    *pp_Var65 = _Var75._M_nxt;
  }
  goto LAB_00453522;
code_r0x00454076:
  bVar31 = VVar73 == (pointer)&DAT_00000001;
  VVar64.int_ = 0;
  VVar73.uint_ = (ulong)&((VVar73.map_)->_M_t)._M_impl.field_0x1 >> 1;
  if (bVar31) {
    VVar73.int_ = 0;
  }
  goto LAB_00454059;
}

Assistant:

Json::Value Target::Dump()
{
  Json::Value target = Json::objectValue;

  cmStateEnums::TargetType const type = this->GT->GetType();

  target["name"] = this->GT->GetName();
  target["type"] = cmState::GetTargetTypeName(type);
  target["id"] = TargetId(this->GT, this->TopBuild);
  target["paths"] = this->DumpPaths();
  if (this->GT->Target->GetIsGeneratorProvided()) {
    target["isGeneratorProvided"] = true;
  }

  this->AddBacktrace(target, this->GT->GetBacktrace());

  if (this->GT->Target->GetHaveInstallRule()) {
    target["install"] = this->DumpInstall();
  }

  if (this->GT->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = this->DumpArtifacts();
    if (!artifacts.empty()) {
      target["artifacts"] = std::move(artifacts);
    }
  }

  if (type == cmStateEnums::EXECUTABLE ||
      type == cmStateEnums::SHARED_LIBRARY ||
      type == cmStateEnums::MODULE_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["link"] = this->DumpLink();
  } else if (type == cmStateEnums::STATIC_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["archive"] = this->DumpArchive();
  }

  if (type == cmStateEnums::EXECUTABLE) {
    Json::Value launchers = this->DumpLaunchers();
    if (!launchers.empty()) {
      target["launchers"] = std::move(launchers);
    }
  }

  Json::Value dependencies = this->DumpDependencies();
  if (!dependencies.empty()) {
    target["dependencies"] = dependencies;
  }

  {
    this->ProcessLanguages();

    auto fileSetInfo = this->DumpFileSets();

    if (!fileSetInfo.first.isNull()) {
      target["fileSets"] = fileSetInfo.first;
    }

    target["sources"] = this->DumpSources(fileSetInfo.second);

    Json::Value folder = this->DumpFolder();
    if (!folder.isNull()) {
      target["folder"] = std::move(folder);
    }

    Json::Value sourceGroups = this->DumpSourceGroups();
    if (!sourceGroups.empty()) {
      target["sourceGroups"] = std::move(sourceGroups);
    }

    Json::Value compileGroups = this->DumpCompileGroups();
    if (!compileGroups.empty()) {
      target["compileGroups"] = std::move(compileGroups);
    }
  }

  target["backtraceGraph"] = this->Backtraces.Dump();

  return target;
}